

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void snapshot_with_uncomitted_data_test(void)

{
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  fdb_doc *doc;
  fdb_status fVar4;
  int iVar5;
  fdb_status fVar6;
  fdb_kvs_handle *pfVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  __atomic_base<unsigned_long> _Var11;
  char *handle;
  fdb_kvs_handle *pfVar12;
  fdb_iterator *doc_00;
  fdb_kvs_handle *pfVar13;
  fdb_kvs_handle *in_RCX;
  fdb_kvs_handle *extraout_RDX;
  fdb_kvs_handle *pfVar14;
  fdb_kvs_handle *doc_01;
  uint uVar15;
  __atomic_base<unsigned_long> unaff_RBP;
  long lVar16;
  __atomic_base<unsigned_long> _Var17;
  fdb_iterator *pfVar18;
  char *unaff_R12;
  char *unaff_R13;
  long lVar19;
  char *pcVar20;
  ulong uVar21;
  fdb_config *pfVar22;
  char *unaff_R15;
  fdb_doc **ppfVar23;
  fdb_iterator *config;
  fdb_kvs_handle *snap;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *db0;
  fdb_kvs_handle *db1;
  fdb_file_handle *db_file;
  fdb_kvs_info info;
  timeval __test_begin;
  char key [256];
  char cmd [256];
  fdb_doc *pfStack_1bb8;
  fdb_iterator *pfStack_1bb0;
  int iStack_1ba4;
  fdb_kvs_handle *pfStack_1ba0;
  timeval tStack_1b98;
  fdb_kvs_handle *pfStack_1b88;
  fdb_kvs_handle *pfStack_1b80;
  fdb_kvs_handle *pfStack_1b78;
  fdb_kvs_handle *pfStack_1b70;
  fdb_iterator *pfStack_1b68;
  fdb_iterator *pfStack_1b60;
  fdb_kvs_handle *pfStack_1b50;
  fdb_kvs_handle *pfStack_1b48;
  undefined1 auStack_1b40 [24];
  fdb_kvs_handle *pfStack_1b28;
  fdb_kvs_handle *pfStack_1b20;
  fdb_kvs_handle *pfStack_1b18;
  fdb_kvs_handle *pfStack_1b10;
  undefined1 auStack_1b08 [80];
  undefined8 auStack_1ab8 [5];
  fdb_doc *apfStack_1a90 [6];
  fdb_kvs_info fStack_1a60;
  timeval tStack_1a30;
  undefined1 auStack_1a20 [280];
  fdb_iterator fStack_1908;
  fdb_kvs_handle fStack_1808;
  fdb_kvs_handle *pfStack_1600;
  fdb_kvs_handle *pfStack_15f8;
  fdb_kvs_handle *pfStack_15f0;
  code *pcStack_15e8;
  fdb_kvs_handle *pfStack_15d8;
  fdb_iterator *pfStack_15d0;
  fdb_kvs_handle *pfStack_15c8;
  fdb_kvs_handle *pfStack_15c0;
  fdb_custom_cmp_variable *pp_Stack_15b8;
  size_t sStack_15b0;
  fdb_kvs_handle *pfStack_15a8;
  fdb_kvs_info fStack_15a0;
  undefined1 auStack_1570 [10];
  undefined1 auStack_1566 [14];
  undefined2 uStack_1558;
  fdb_encryption_key afStack_1460 [7];
  fdb_kvs_handle *pfStack_1358;
  fdb_kvs_handle *pfStack_1350;
  fdb_kvs_handle *pfStack_1348;
  fdb_kvs_handle *pfStack_1340;
  fdb_kvs_handle *pfStack_1338;
  fdb_kvs_handle *pfStack_1330;
  undefined1 auStack_1320 [8];
  fdb_file_handle *pfStack_1318;
  fdb_kvs_handle *pfStack_1310;
  fdb_kvs_handle *pfStack_1308;
  fdb_iterator *pfStack_1300;
  undefined1 auStack_12f8 [48];
  undefined1 auStack_12c8 [64];
  hbtrie *phStack_1288;
  kvs_ops_stat *pkStack_1280;
  timeval tStack_1258;
  btreeblk_handle *apbStack_1248 [33];
  undefined1 auStack_1140 [32];
  undefined2 uStack_1120;
  undefined1 uStack_1100;
  code *pcStack_10e8;
  undefined4 uStack_10e0;
  fdb_txn *pfStack_10d8;
  fdb_kvs_handle *pfStack_1048;
  char acStack_1040 [256];
  fdb_kvs_handle *pfStack_f40;
  fdb_kvs_handle *pfStack_f38;
  fdb_kvs_handle *pfStack_f30;
  fdb_kvs_handle *pfStack_f28;
  fdb_kvs_handle *pfStack_f20;
  fdb_kvs_handle *pfStack_f18;
  fdb_kvs_handle *pfStack_f08;
  uint uStack_efc;
  fdb_iterator *pfStack_ef8;
  fdb_kvs_handle *pfStack_ef0;
  undefined4 *puStack_ee8;
  fdb_kvs_handle *pfStack_ee0;
  fdb_kvs_handle *pfStack_ed8;
  fdb_iterator *pfStack_ed0;
  fdb_file_handle *pfStack_ec8;
  fdb_iterator *pfStack_ec0;
  size_t sStack_eb8;
  undefined1 auStack_eb0 [32];
  timeval tStack_e90;
  undefined1 auStack_e80 [272];
  size_t sStack_d70;
  char *pcStack_d68;
  uint8_t uStack_d60;
  undefined2 uStack_d58;
  undefined1 uStack_d38;
  fdb_kvs_handle *pfStack_c80;
  char acStack_c78 [256];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_b78;
  fdb_kvs_handle *pfStack_b70;
  fdb_kvs_handle *pfStack_b68;
  fdb_kvs_handle *pfStack_b60;
  fdb_kvs_handle *pfStack_b58;
  fdb_kvs_handle *pfStack_b50;
  fdb_kvs_handle *pfStack_b40;
  fdb_file_handle *pfStack_b38;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_b30;
  fdb_doc *pfStack_b28;
  fdb_kvs_handle *pfStack_b20;
  fdb_kvs_handle *pfStack_b18;
  fdb_kvs_handle *pfStack_b10;
  fdb_kvs_handle *pfStack_b08;
  fdb_kvs_handle *pfStack_b00;
  fdb_kvs_handle *pfStack_af8;
  fdb_kvs_config fStack_af0;
  fdb_kvs_config fStack_ad8;
  fdb_kvs_config fStack_ab8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_a98 [4];
  timeval tStack_a78;
  fdb_config fStack_a68;
  fdb_kvs_info *pfStack_950;
  atomic<unsigned_long> aStack_948;
  fdb_kvs_handle *pfStack_940;
  atomic<unsigned_long> aStack_938;
  fdb_kvs_handle *pfStack_930;
  atomic<unsigned_long> aStack_928;
  fdb_kvs_handle *pfStack_918;
  fdb_kvs_handle *pfStack_910;
  fdb_file_handle *pfStack_908;
  undefined1 auStack_900 [16];
  fdb_config *pfStack_8f0;
  fdb_kvs_info fStack_8e8;
  fdb_kvs_config fStack_8b8;
  undefined1 auStack_8a0 [176];
  char acStack_7f0 [256];
  undefined1 auStack_6f0 [512];
  fdb_config fStack_4f0;
  fdb_kvs_handle *pfStack_3f8;
  fdb_kvs_handle *pfStack_3f0;
  fdb_kvs_handle *pfStack_3e8;
  fdb_kvs_handle *pfStack_3e0;
  fdb_kvs_handle *pfStack_3d8;
  fdb_kvs_handle *pfStack_3d0;
  fdb_kvs_handle *local_3c8;
  fdb_kvs_handle *local_3c0;
  fdb_kvs_handle *local_3b8;
  fdb_kvs_handle *local_3b0;
  fdb_file_handle *local_3a8;
  undefined4 *local_3a0;
  undefined1 local_398 [48];
  fdb_kvs_handle *local_368;
  undefined1 local_360 [40];
  fdb_kvs_handle local_338;
  char acStack_130 [256];
  
  pfStack_3d0 = (fdb_kvs_handle *)0x1114fc;
  gettimeofday((timeval *)(local_360 + 0x18),(__timezone_ptr_t)0x0);
  local_338.bub_ctx.handle = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_130,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_3d0 = (fdb_kvs_handle *)0x111524;
  system((char *)&local_338.bub_ctx.handle);
  pfStack_3d0 = (fdb_kvs_handle *)0x111529;
  memleak_start();
  pfStack_3d0 = (fdb_kvs_handle *)0x111533;
  pfVar7 = (fdb_kvs_handle *)malloc(0x20);
  pfStack_3d0 = (fdb_kvs_handle *)0x111540;
  srand(0x4d2);
  pfVar14 = (fdb_kvs_handle *)(local_338.config.encryption_key.bytes + 4);
  pfStack_3d0 = (fdb_kvs_handle *)0x111550;
  fdb_get_default_config();
  local_338.config.block_reusing_threshold._0_1_ = 1;
  local_338.config.encryption_key.bytes[0x1c] = '\x01';
  local_338.config.breakpad_minidump_dir._0_1_ = 1;
  local_338.config.encryption_key.bytes[0xc] = '\0';
  local_338.config.encryption_key.bytes[0xd] = '\0';
  local_338.config.encryption_key.bytes[0xe] = '\0';
  local_338.config.encryption_key.bytes[0xf] = '\0';
  local_338.config.encryption_key.bytes[0x10] = '\0';
  local_338.config.encryption_key.bytes[0x11] = '\0';
  local_338.config.encryption_key.bytes[0x12] = '\0';
  local_338.config.encryption_key.bytes[0x13] = '\0';
  pfStack_3d0 = (fdb_kvs_handle *)0x111570;
  fdb_get_default_kvs_config();
  pfStack_3d0 = (fdb_kvs_handle *)0x111584;
  fVar4 = fdb_open(&local_3a8,"./mvcc_test9",(fdb_config *)pfVar14);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a3c;
  in_RCX = (fdb_kvs_handle *)local_360;
  pfStack_3d0 = (fdb_kvs_handle *)0x1115a2;
  fVar4 = fdb_kvs_open(local_3a8,&local_3b8,(char *)0x0,(fdb_kvs_config *)in_RCX);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a41;
  in_RCX = (fdb_kvs_handle *)local_360;
  pfStack_3d0 = (fdb_kvs_handle *)0x1115c5;
  fVar4 = fdb_kvs_open(local_3a8,&local_3b0,"db1",(fdb_kvs_config *)in_RCX);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a46;
  in_RCX = (fdb_kvs_handle *)local_360;
  pfStack_3d0 = (fdb_kvs_handle *)0x1115e8;
  fVar4 = fdb_kvs_open(local_3a8,&local_3c0,"db2",(fdb_kvs_config *)in_RCX);
  pcVar20 = (char *)pfVar14;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a4b;
  local_3a0 = (undefined4 *)((long)&pfVar7->kvs + 2);
  pcVar20 = "key%06d";
  unaff_R15 = (char *)&local_338;
  unaff_R12 = "value%d";
  unaff_RBP._M_i = 0;
  do {
    pfStack_3d0 = (fdb_kvs_handle *)0x111623;
    sprintf(unaff_R15,"key%06d",unaff_RBP._M_i);
    *(undefined4 *)&pfVar7->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar7->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar7->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)&(pfVar7->kvs_config).custom_cmp_param = 0x78787878;
    *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp_param + 4) = 0x78787878;
    *(undefined4 *)&pfVar7->kvs = 0x78787878;
    *(uint32_t *)((long)&pfVar7->kvs + 4) = 0x78787878;
    *(undefined2 *)(local_3a0 + 1) = 0x3e;
    *local_3a0 = 0x646e653c;
    pfStack_3d0 = (fdb_kvs_handle *)0x111651;
    sprintf((char *)pfVar7,"value%d",unaff_RBP._M_i);
    pfVar14 = local_3b8;
    pfStack_3d0 = (fdb_kvs_handle *)0x11165e;
    sVar8 = strlen(unaff_R15);
    pfStack_3d0 = (fdb_kvs_handle *)0x111676;
    in_RCX = pfVar7;
    fVar4 = fdb_set_kv(pfVar14,unaff_R15,sVar8 + 1,pfVar7,0x20);
    pfVar12 = local_3b0;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      pfStack_3d0 = (fdb_kvs_handle *)0x111a28;
      snapshot_with_uncomitted_data_test();
LAB_00111a28:
      unaff_R13 = (char *)pfVar14;
      pfStack_3d0 = (fdb_kvs_handle *)0x111a2d;
      snapshot_with_uncomitted_data_test();
LAB_00111a2d:
      pfStack_3d0 = (fdb_kvs_handle *)0x111a32;
      snapshot_with_uncomitted_data_test();
      goto LAB_00111a32;
    }
    pfStack_3d0 = (fdb_kvs_handle *)0x11168b;
    sVar8 = strlen(unaff_R15);
    pfStack_3d0 = (fdb_kvs_handle *)0x1116a3;
    in_RCX = pfVar7;
    fVar4 = fdb_set_kv(pfVar12,unaff_R15,sVar8 + 1,pfVar7,0x20);
    unaff_R13 = (char *)local_3c0;
    pfVar14 = pfVar12;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a28;
    pfStack_3d0 = (fdb_kvs_handle *)0x1116b8;
    sVar8 = strlen(unaff_R15);
    pfStack_3d0 = (fdb_kvs_handle *)0x1116d0;
    in_RCX = pfVar7;
    fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,unaff_R15,sVar8 + 1,pfVar7,0x20);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a2d;
    uVar15 = (int)unaff_RBP._M_i + 1;
    unaff_RBP._M_i = (__int_type)uVar15;
  } while (uVar15 != 10);
  pfStack_3d0 = (fdb_kvs_handle *)0x1116f2;
  fVar4 = fdb_get_kvs_info(local_3b8,(fdb_kvs_info *)local_398);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a50;
  pfStack_3d0 = (fdb_kvs_handle *)0x11170c;
  fVar4 = fdb_snapshot_open(local_3b8,&local_3c8,local_398._8_8_);
  if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00111a55;
  pfStack_3d0 = (fdb_kvs_handle *)0x111723;
  fVar4 = fdb_get_kvs_info(local_3b0,(fdb_kvs_info *)local_398);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a5a;
  pfStack_3d0 = (fdb_kvs_handle *)0x11173d;
  fVar4 = fdb_snapshot_open(local_3b0,&local_3c8,local_398._8_8_);
  if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00111a5f;
  pfStack_3d0 = (fdb_kvs_handle *)0x111754;
  fVar4 = fdb_get_kvs_info(local_3c0,(fdb_kvs_info *)local_398);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a64;
  pfStack_3d0 = (fdb_kvs_handle *)0x11176e;
  fVar4 = fdb_snapshot_open(local_3c0,&local_3c8,local_398._8_8_);
  if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00111a69;
  pfStack_3d0 = (fdb_kvs_handle *)0x111782;
  fVar4 = fdb_commit(local_3a8,'\0');
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a6e;
  pfStack_3d0 = (fdb_kvs_handle *)0x111799;
  fVar4 = fdb_get_kvs_info(local_3b0,(fdb_kvs_info *)local_398);
  pfVar14 = (fdb_kvs_handle *)local_398._8_8_;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a73;
  pfStack_3d0 = (fdb_kvs_handle *)0x1117b4;
  fVar4 = fdb_get_kvs_info(local_3c0,(fdb_kvs_info *)local_398);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a78;
  unaff_R15 = local_398 + 8;
  if (pfVar14 != (fdb_kvs_handle *)local_398._8_8_) {
    pfStack_3d0 = (fdb_kvs_handle *)0x1117d1;
    snapshot_with_uncomitted_data_test();
  }
  pfStack_3d0 = (fdb_kvs_handle *)0x1117e0;
  fVar4 = fdb_get_kvs_info(local_3b8,(fdb_kvs_info *)local_398);
  pcVar20 = (char *)pfVar14;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a7d;
  if (pfVar14 != (fdb_kvs_handle *)local_398._8_8_) {
    pfStack_3d0 = (fdb_kvs_handle *)0x1117fa;
    snapshot_with_uncomitted_data_test();
  }
  local_368 = pfVar14;
  unaff_R15 = "key%06d";
  unaff_R12 = (char *)&local_338;
  unaff_R13 = "value%d";
  unaff_RBP._M_i = 0;
  do {
    pfStack_3d0 = (fdb_kvs_handle *)0x111826;
    sprintf(unaff_R12,"key%06d",unaff_RBP._M_i);
    *(undefined4 *)&pfVar7->kvs_config = 0x78787878;
    *(undefined4 *)&(pfVar7->kvs_config).field_0x4 = 0x78787878;
    *(undefined4 *)&(pfVar7->kvs_config).custom_cmp = 0x78787878;
    *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 4) = 0x78787878;
    *(undefined4 *)&(pfVar7->kvs_config).custom_cmp_param = 0x78787878;
    *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp_param + 4) = 0x78787878;
    *(undefined4 *)&pfVar7->kvs = 0x78787878;
    *(uint32_t *)((long)&pfVar7->kvs + 4) = 0x78787878;
    *(undefined2 *)(local_3a0 + 1) = 0x3e;
    *local_3a0 = 0x646e653c;
    pfStack_3d0 = (fdb_kvs_handle *)0x111854;
    sprintf((char *)pfVar7,"value%d",unaff_RBP._M_i);
    pfVar14 = local_3b8;
    pfStack_3d0 = (fdb_kvs_handle *)0x111861;
    sVar8 = strlen(unaff_R12);
    pfStack_3d0 = (fdb_kvs_handle *)0x111879;
    in_RCX = pfVar7;
    fVar4 = fdb_set_kv(pfVar14,unaff_R12,sVar8 + 1,pfVar7,0x20);
    pcVar20 = (char *)local_3c0;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a37;
    pfStack_3d0 = (fdb_kvs_handle *)0x11188e;
    sVar8 = strlen(unaff_R12);
    pfStack_3d0 = (fdb_kvs_handle *)0x1118a6;
    in_RCX = pfVar7;
    fVar4 = fdb_set_kv((fdb_kvs_handle *)pcVar20,unaff_R12,sVar8 + 1,pfVar7,0x20);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a32;
    uVar15 = (int)unaff_RBP._M_i + 1;
    unaff_RBP._M_i = (__int_type)uVar15;
  } while (uVar15 != 10);
  pfStack_3d0 = (fdb_kvs_handle *)0x1118c8;
  fVar4 = fdb_get_kvs_info(local_3b0,(fdb_kvs_info *)local_398);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a82;
  pfStack_3d0 = (fdb_kvs_handle *)0x1118e2;
  fVar4 = fdb_snapshot_open(local_3b0,&local_3c8,local_398._8_8_);
  pcVar20 = (char *)local_368;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a87;
  pfStack_3d0 = (fdb_kvs_handle *)0x1118f8;
  fVar4 = fdb_kvs_close(local_3c8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a8c;
  pfStack_3d0 = (fdb_kvs_handle *)0x11190f;
  fVar4 = fdb_get_kvs_info(local_3c0,(fdb_kvs_info *)local_398);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a91;
  pfStack_3d0 = (fdb_kvs_handle *)0x111929;
  fVar4 = fdb_snapshot_open(local_3c0,&local_3c8,local_398._8_8_);
  if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00111a96;
  pfStack_3d0 = (fdb_kvs_handle *)0x111941;
  fVar4 = fdb_snapshot_open(local_3c0,&local_3c8,(fdb_seqnum_t)pcVar20);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111a9b;
  pfStack_3d0 = (fdb_kvs_handle *)0x111952;
  fVar4 = fdb_kvs_close(local_3c8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111aa0;
  pfStack_3d0 = (fdb_kvs_handle *)0x111969;
  fVar4 = fdb_get_kvs_info(local_3b8,(fdb_kvs_info *)local_398);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111aa5;
  pfStack_3d0 = (fdb_kvs_handle *)0x111983;
  fVar4 = fdb_snapshot_open(local_3b8,&local_3c8,local_398._8_8_);
  if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00111aaa;
  pfStack_3d0 = (fdb_kvs_handle *)0x11199b;
  fVar4 = fdb_snapshot_open(local_3b8,&local_3c8,(fdb_seqnum_t)pcVar20);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111aaf;
  pfStack_3d0 = (fdb_kvs_handle *)0x1119ac;
  fVar4 = fdb_kvs_close(local_3c8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111ab4;
  pfStack_3d0 = (fdb_kvs_handle *)0x1119be;
  fVar4 = fdb_close(local_3a8);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00111ab9;
  pfStack_3d0 = (fdb_kvs_handle *)0x1119cb;
  fVar4 = fdb_shutdown();
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_3d0 = (fdb_kvs_handle *)0x1119db;
    free(pfVar7);
    pfStack_3d0 = (fdb_kvs_handle *)0x1119e0;
    memleak_end();
    pcVar20 = "%s PASSED\n";
    if (snapshot_with_uncomitted_data_test()::__test_pass != '\0') {
      pcVar20 = "%s FAILED\n";
    }
    pfStack_3d0 = (fdb_kvs_handle *)0x111a11;
    fprintf(_stderr,pcVar20,"snapshot with uncomitted data in other KVS test");
    return;
  }
  goto LAB_00111abe;
LAB_00112f50:
  pfStack_f18 = (fdb_kvs_handle *)0x112f55;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f55:
  pfStack_f18 = (fdb_kvs_handle *)0x112f5a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f5a:
  pfStack_f18 = (fdb_kvs_handle *)0x112f6a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f6a:
  pfStack_f18 = (fdb_kvs_handle *)0x112f75;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f75:
  pfStack_f18 = (fdb_kvs_handle *)0x112f85;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f85:
  pfVar14 = (fdb_kvs_handle *)pcVar20;
  pfStack_f18 = (fdb_kvs_handle *)0x112f8a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f8a:
  pfStack_f18 = (fdb_kvs_handle *)0x112f9a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f9a:
  pfStack_f18 = (fdb_kvs_handle *)0x112fa5;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fa5:
  pfStack_f18 = (fdb_kvs_handle *)0x112fb0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fb0:
  pfStack_f18 = (fdb_kvs_handle *)0x112fc0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fc0:
  pfStack_f18 = (fdb_kvs_handle *)0x112fcb;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fcb:
  pfStack_f18 = (fdb_kvs_handle *)0x112fd0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fd0:
  pfStack_f18 = (fdb_kvs_handle *)0x112fd5;
  in_memory_snapshot_on_dirty_hbtrie_test();
  goto LAB_00112fd5;
LAB_0011350e:
  pfStack_1330 = (fdb_kvs_handle *)0x11351e;
  in_memory_snapshot_compaction_test();
LAB_0011351e:
  pfStack_1330 = (fdb_kvs_handle *)0x113529;
  in_memory_snapshot_compaction_test();
LAB_00113529:
  pfStack_1330 = (fdb_kvs_handle *)0x113539;
  in_memory_snapshot_compaction_test();
LAB_00113539:
  pfStack_1330 = (fdb_kvs_handle *)0x113544;
  in_memory_snapshot_compaction_test();
  goto LAB_00113544;
LAB_00113a98:
  pcStack_15e8 = (code *)0x113aa8;
  cb_inmem_snap();
LAB_00113aa8:
  pcStack_15e8 = (code *)0x113ab8;
  cb_inmem_snap();
LAB_00113ab8:
  pcStack_15e8 = (code *)0x113ac8;
  cb_inmem_snap();
LAB_00113ac8:
  pfVar14 = (fdb_kvs_handle *)afStack_1460;
  unaff_R12 = auStack_1566 + 6;
  pcStack_15e8 = (code *)0x113ad8;
  cb_inmem_snap();
  goto LAB_00113ad8;
LAB_0011456a:
  pfStack_1b60 = (fdb_iterator *)0x114575;
  snapshot_clone_test();
  pfVar13 = pfVar7;
LAB_00114575:
  pfVar7 = pfVar13;
  pfStack_1b60 = (fdb_iterator *)0x11457a;
  snapshot_clone_test();
LAB_0011457a:
  pfStack_1b60 = (fdb_iterator *)0x114585;
  snapshot_clone_test();
LAB_00114585:
  pfVar14 = (fdb_kvs_handle *)&pfStack_1b48;
  pfStack_1b60 = (fdb_iterator *)0x114590;
  snapshot_clone_test();
  goto LAB_00114590;
LAB_00111a32:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a37;
  snapshot_with_uncomitted_data_test();
  pfVar14 = (fdb_kvs_handle *)pcVar20;
LAB_00111a37:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a3c;
  snapshot_with_uncomitted_data_test();
LAB_00111a3c:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a41;
  snapshot_with_uncomitted_data_test();
LAB_00111a41:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a46;
  snapshot_with_uncomitted_data_test();
LAB_00111a46:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a4b;
  snapshot_with_uncomitted_data_test();
  pcVar20 = (char *)pfVar14;
LAB_00111a4b:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a50;
  snapshot_with_uncomitted_data_test();
LAB_00111a50:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a55;
  snapshot_with_uncomitted_data_test();
LAB_00111a55:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a5a;
  snapshot_with_uncomitted_data_test();
LAB_00111a5a:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a5f;
  snapshot_with_uncomitted_data_test();
LAB_00111a5f:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a64;
  snapshot_with_uncomitted_data_test();
LAB_00111a64:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a69;
  snapshot_with_uncomitted_data_test();
LAB_00111a69:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a6e;
  snapshot_with_uncomitted_data_test();
LAB_00111a6e:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a73;
  snapshot_with_uncomitted_data_test();
LAB_00111a73:
  pfVar14 = (fdb_kvs_handle *)pcVar20;
  pfStack_3d0 = (fdb_kvs_handle *)0x111a78;
  snapshot_with_uncomitted_data_test();
LAB_00111a78:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a7d;
  snapshot_with_uncomitted_data_test();
  pcVar20 = (char *)pfVar14;
LAB_00111a7d:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a82;
  snapshot_with_uncomitted_data_test();
LAB_00111a82:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a87;
  snapshot_with_uncomitted_data_test();
LAB_00111a87:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a8c;
  snapshot_with_uncomitted_data_test();
LAB_00111a8c:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a91;
  snapshot_with_uncomitted_data_test();
LAB_00111a91:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a96;
  snapshot_with_uncomitted_data_test();
LAB_00111a96:
  pfStack_3d0 = (fdb_kvs_handle *)0x111a9b;
  snapshot_with_uncomitted_data_test();
LAB_00111a9b:
  pfStack_3d0 = (fdb_kvs_handle *)0x111aa0;
  snapshot_with_uncomitted_data_test();
LAB_00111aa0:
  pfStack_3d0 = (fdb_kvs_handle *)0x111aa5;
  snapshot_with_uncomitted_data_test();
LAB_00111aa5:
  pfStack_3d0 = (fdb_kvs_handle *)0x111aaa;
  snapshot_with_uncomitted_data_test();
LAB_00111aaa:
  pfStack_3d0 = (fdb_kvs_handle *)0x111aaf;
  snapshot_with_uncomitted_data_test();
LAB_00111aaf:
  pfStack_3d0 = (fdb_kvs_handle *)0x111ab4;
  snapshot_with_uncomitted_data_test();
LAB_00111ab4:
  pfStack_3d0 = (fdb_kvs_handle *)0x111ab9;
  snapshot_with_uncomitted_data_test();
LAB_00111ab9:
  pfStack_3d0 = (fdb_kvs_handle *)0x111abe;
  snapshot_with_uncomitted_data_test();
LAB_00111abe:
  pfStack_3d0 = (fdb_kvs_handle *)in_memory_snapshot_test;
  snapshot_with_uncomitted_data_test();
  aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ae3;
  pfStack_3f8 = pfVar7;
  pfStack_3f0 = (fdb_kvs_handle *)unaff_R12;
  pfStack_3e8 = (fdb_kvs_handle *)unaff_R13;
  pfStack_3e0 = (fdb_kvs_handle *)pcVar20;
  pfStack_3d8 = (fdb_kvs_handle *)unaff_R15;
  pfStack_3d0 = (fdb_kvs_handle *)unaff_RBP._M_i;
  gettimeofday((timeval *)(auStack_8a0 + 0xa0),(__timezone_ptr_t)0x0);
  aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ae8;
  memleak_start();
  pcVar20 = "rm -rf  mvcc_test* > errorlog.txt";
  aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111af7;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar22 = &fStack_4f0;
  aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b07;
  fdb_get_default_config();
  aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b11;
  fdb_get_default_kvs_config();
  fStack_4f0.buffercache_size = 0;
  fStack_4f0.wal_threshold = 0x400;
  fStack_4f0.flags = 1;
  fStack_4f0.compaction_threshold = '\0';
  aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b36;
  system("rm -rf  mvcc_test* > errorlog.txt");
  aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b4a;
  fVar4 = fdb_open(&pfStack_908,"./mvcc_test1",pfVar22);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b66;
    fVar4 = fdb_kvs_open_default(pfStack_908,&pfStack_918,&fStack_8b8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011224b;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b7f;
    fVar4 = fdb_snapshot_open(pfStack_918,&pfStack_910,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112250;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b96;
    fdb_get_kvs_info(pfStack_910,&fStack_8e8);
    if ((fdb_config *)fStack_8e8.last_seqnum != (fdb_config *)0x0) {
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ba6;
      in_memory_snapshot_test();
    }
    pcVar20 = auStack_900;
    in_RCX = (fdb_kvs_handle *)0x0;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bc9;
    fdb_iterator_init(pfStack_910,(fdb_iterator **)pcVar20,(void *)0x0,0,(void *)0x0,0,0);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bd6;
    fVar4 = fdb_iterator_get((fdb_iterator *)auStack_900._0_8_,(fdb_doc **)(auStack_900 + 8));
    _Var11._M_i = (__int_type)pfVar22;
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00112255;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111be9;
    fdb_iterator_close((fdb_iterator *)auStack_900._0_8_);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bf3;
    fdb_kvs_close(pfStack_910);
    lVar19 = 0;
    uVar21 = 0;
    do {
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c15;
      sprintf(acStack_7f0,"key%d",uVar21 & 0xffffffff);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c31;
      sprintf(auStack_6f0,"meta%d",uVar21 & 0xffffffff);
      pcVar20 = auStack_6f0 + 0x100;
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c4d;
      sprintf(pcVar20,"body%d",uVar21 & 0xffffffff);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c60;
      sVar8 = strlen(acStack_7f0);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c6b;
      sVar9 = strlen(auStack_6f0);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c76;
      sVar10 = strlen(pcVar20);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c9b;
      fdb_doc_create((fdb_doc **)(auStack_8a0 + lVar19),acStack_7f0,sVar8,auStack_6f0,sVar9,pcVar20,
                     sVar10);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cad;
      fdb_set(pfStack_918,*(fdb_doc **)(auStack_8a0 + uVar21 * 8));
      uVar21 = uVar21 + 1;
      lVar19 = lVar19 + 8;
    } while (uVar21 != 5);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ccd;
    fdb_commit(pfStack_908,'\x01');
    uVar21 = 5;
    ppfVar23 = (fdb_doc **)(auStack_8a0 + 0x28);
    do {
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cf7;
      sprintf(acStack_7f0,"key%d",uVar21 & 0xffffffff);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d13;
      sprintf(auStack_6f0,"meta%d",uVar21 & 0xffffffff);
      pcVar20 = auStack_6f0 + 0x100;
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d2f;
      sprintf(pcVar20,"body%d",uVar21 & 0xffffffff);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d37;
      sVar8 = strlen(acStack_7f0);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d42;
      sVar9 = strlen(auStack_6f0);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d4d;
      sVar10 = strlen(pcVar20);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d6d;
      fdb_doc_create(ppfVar23,acStack_7f0,sVar8,auStack_6f0,sVar9,pcVar20,sVar10);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d7a;
      fdb_set(pfStack_918,*ppfVar23);
      uVar21 = uVar21 + 1;
      ppfVar23 = ppfVar23 + 1;
    } while (uVar21 != 9);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111da9;
    sprintf(acStack_7f0,"key%d",9);
    unaff_R15 = auStack_6f0;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111dc7;
    sprintf(unaff_R15,"meta%d",9);
    unaff_R12 = auStack_6f0 + 0x100;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111de5;
    sprintf(unaff_R12,"Body%d",9);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111df5;
    unaff_R13 = (char *)strlen(acStack_7f0);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e00;
    unaff_RBP._M_i = strlen(unaff_R15);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e0b;
    sVar8 = strlen(unaff_R12);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e26;
    in_RCX = (fdb_kvs_handle *)unaff_R15;
    fdb_doc_create((fdb_doc **)(auStack_8a0 + 0x48),acStack_7f0,(size_t)unaff_R13,unaff_R15,
                   unaff_RBP._M_i,unaff_R12,sVar8);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e33;
    fdb_set(pfStack_918,(fdb_doc *)auStack_8a0._72_8_);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e3f;
    fdb_commit(pfStack_908,'\0');
    **(undefined1 **)(auStack_8a0._72_8_ + 0x40) = 0x62;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e56;
    fdb_set(pfStack_918,(fdb_doc *)auStack_8a0._72_8_);
    _Var11._M_i = *(fdb_seqnum_t *)(auStack_8a0._72_8_ + 0x28);
    pcVar20 = (char *)&fStack_8e8;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e6f;
    fdb_get_kvs_info(pfStack_918,(fdb_kvs_info *)pcVar20);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e82;
    fVar4 = fdb_snapshot_open(pfStack_918,&pfStack_910,fStack_8e8.last_seqnum);
    if (fVar4 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0011225a;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ea6;
    pfStack_8f0 = (fdb_config *)_Var11._M_i;
    fVar4 = fdb_snapshot_open(pfStack_918,&pfStack_910,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011225f;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111eba;
    fdb_commit(pfStack_908,'\0');
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ecc;
    fdb_set(pfStack_918,(fdb_doc *)auStack_8a0._72_8_);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ed8;
    fdb_commit(pfStack_908,'\0');
    uVar21 = 10;
    pcVar20 = (char *)0x50;
    do {
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111eff;
      sprintf(acStack_7f0,"key%d",uVar21 & 0xffffffff);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f1b;
      sprintf(auStack_6f0,"meta%d",uVar21 & 0xffffffff);
      unaff_R12 = auStack_6f0 + 0x100;
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f37;
      sprintf(unaff_R12,"body%d",uVar21 & 0xffffffff);
      unaff_RBP._M_i = (__int_type)(auStack_8a0 + (long)pcVar20);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f4a;
      _Var11._M_i = strlen(acStack_7f0);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f55;
      unaff_R13 = (char *)strlen(auStack_6f0);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f60;
      sVar8 = strlen(unaff_R12);
      in_RCX = (fdb_kvs_handle *)auStack_6f0;
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f85;
      fdb_doc_create((fdb_doc **)unaff_RBP._M_i,acStack_7f0,_Var11._M_i,in_RCX,(size_t)unaff_R13,
                     unaff_R12,sVar8);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f97;
      fdb_set(pfStack_918,*(fdb_doc **)(auStack_8a0 + uVar21 * 8));
      uVar21 = uVar21 + 1;
      pcVar20 = (char *)((long)pcVar20 + 8);
    } while (uVar21 != 0xf);
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fc0;
    fVar4 = fdb_set_log_callback(pfStack_918,logCallbackFunc,"in_memory_snapshot_test");
    unaff_R15 = (char *)0xf;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112264;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fda;
    fdb_get_kvs_info(pfStack_910,&fStack_8e8);
    if ((fdb_config *)fStack_8e8.last_seqnum != pfStack_8f0) {
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fef;
      in_memory_snapshot_test();
    }
    uVar21 = 0xf;
    pfVar22 = (fdb_config *)(auStack_8a0 + 0x78);
    do {
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112017;
      sprintf(acStack_7f0,"key%d",uVar21 & 0xffffffff);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112032;
      sprintf(auStack_6f0,"meta%d",uVar21 & 0xffffffff);
      unaff_RBP._M_i = (__int_type)(auStack_6f0 + 0x100);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11204d;
      sprintf((char *)unaff_RBP._M_i,"body%d",uVar21 & 0xffffffff);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112055;
      unaff_R15 = (char *)strlen(acStack_7f0);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112060;
      unaff_R12 = (char *)strlen(auStack_6f0);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11206b;
      sVar8 = strlen((char *)unaff_RBP._M_i);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11208b;
      fdb_doc_create((fdb_doc **)pfVar22,acStack_7f0,(size_t)unaff_R15,auStack_6f0,(size_t)unaff_R12
                     ,(void *)unaff_RBP._M_i,sVar8);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112098;
      fdb_set(pfStack_918,*(fdb_doc **)pfVar22);
      uVar21 = uVar21 + 1;
      pfVar22 = (fdb_config *)((long)pfVar22 + 8);
    } while (uVar21 != 0x14);
    unaff_R13 = (char *)0x0;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120b8;
    fdb_commit(pfStack_908,'\0');
    in_RCX = (fdb_kvs_handle *)0x0;
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120d8;
    fdb_iterator_init(pfStack_910,(fdb_iterator **)auStack_900,(void *)0x0,0,(void *)0x0,0,0);
    pcVar20 = auStack_900 + 8;
    auStack_900._8_8_ = (fdb_config *)0x0;
    do {
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120f1;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_900._0_8_,(fdb_doc **)pcVar20);
      _Var11._M_i = auStack_900._8_8_;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0011222b:
        aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112230;
        in_memory_snapshot_test();
LAB_00112230:
        aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11223b;
        in_memory_snapshot_test();
LAB_0011223b:
        aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112246;
        in_memory_snapshot_test();
        goto LAB_00112246;
      }
      unaff_R15 = *(char **)(auStack_900._8_8_ + 0x20);
      unaff_RBP._M_i = *(__int_type *)(auStack_8a0 + (long)unaff_R13 * 8);
      unaff_R12 = (char *)((fdb_kvs_handle *)unaff_RBP._M_i)->op_stats;
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11211c;
      iVar5 = bcmp(unaff_R15,unaff_R12,*(size_t *)auStack_900._8_8_);
      pfVar22 = (fdb_config *)_Var11._M_i;
      if (iVar5 != 0) {
        aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11222b;
        in_memory_snapshot_test();
        goto LAB_0011222b;
      }
      unaff_R15 = *(char **)(_Var11._M_i + 0x38);
      unaff_R12 = (char *)((fdb_kvs_handle *)unaff_RBP._M_i)->staletree;
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11213b;
      iVar5 = bcmp(unaff_R15,unaff_R12,*(uint64_t *)(_Var11._M_i + 8));
      if (iVar5 != 0) goto LAB_0011223b;
      unaff_R15 = *(char **)(_Var11._M_i + 0x40);
      unaff_R12 = (char *)(((fdb_kvs_handle *)unaff_RBP._M_i)->field_6).seqtree;
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11215a;
      iVar5 = bcmp(unaff_R15,unaff_R12,*(uint64_t *)(_Var11._M_i + 0x10));
      if (iVar5 != 0) goto LAB_00112230;
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11216a;
      fdb_doc_free((fdb_doc *)_Var11._M_i);
      auStack_900._8_8_ = (fdb_config *)0x0;
      unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112180;
      fVar4 = fdb_iterator_next((fdb_iterator *)auStack_900._0_8_);
    } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 == 10) {
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11219d;
      fdb_iterator_close((fdb_iterator *)auStack_900._0_8_);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121a7;
      fdb_kvs_close(pfStack_918);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121b1;
      fdb_kvs_close(pfStack_910);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121bb;
      fdb_close(pfStack_908);
      lVar19 = 0;
      do {
        aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121ca;
        fdb_doc_free(*(fdb_doc **)(auStack_8a0 + lVar19 * 8));
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x14);
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121d8;
      fdb_shutdown();
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121dd;
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (in_memory_snapshot_test()::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11220e;
      fprintf(_stderr,pcVar20,"in-memory snapshot test");
      return;
    }
  }
  else {
LAB_00112246:
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11224b;
    in_memory_snapshot_test();
LAB_0011224b:
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112250;
    in_memory_snapshot_test();
LAB_00112250:
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112255;
    in_memory_snapshot_test();
    _Var11._M_i = (__int_type)pfVar22;
LAB_00112255:
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11225a;
    in_memory_snapshot_test();
LAB_0011225a:
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11225f;
    in_memory_snapshot_test();
LAB_0011225f:
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112264;
    in_memory_snapshot_test();
LAB_00112264:
    aStack_928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112269;
    in_memory_snapshot_test();
  }
  aStack_928.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)in_memory_snapshot_cleanup_test;
  in_memory_snapshot_test();
  handle = (char *)0x0;
  pfStack_b50 = (fdb_kvs_handle *)0x112291;
  pfStack_950 = (fdb_kvs_info *)pcVar20;
  aStack_948.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)unaff_R12;
  pfStack_940 = (fdb_kvs_handle *)unaff_R13;
  aStack_938.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var11._M_i;
  pfStack_930 = (fdb_kvs_handle *)unaff_R15;
  aStack_928.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)unaff_RBP._M_i;
  gettimeofday(&tStack_a78,(__timezone_ptr_t)0x0);
  pfStack_b50 = (fdb_kvs_handle *)0x112296;
  memleak_start();
  aStack_b30.seqtree = (btree *)0x0;
  pcVar20 = "rm -rf  mvcc_test* > errorlog.txt";
  pfStack_b50 = (fdb_kvs_handle *)0x1122aa;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar14 = (fdb_kvs_handle *)&fStack_a68.seqtree_opt;
  pfStack_b50 = (fdb_kvs_handle *)0x1122ba;
  fdb_get_default_config();
  pfStack_b50 = (fdb_kvs_handle *)0x1122c4;
  fdb_get_default_kvs_config();
  fStack_a68.compaction_minimum_filesize = 0x400;
  fStack_a68._68_4_ = 1;
  fStack_a68.prefetch_duration._7_1_ = '\0';
  fStack_a68.breakpad_minidump_dir = (char *)0x0;
  pfStack_b50 = (fdb_kvs_handle *)0x1122e8;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_b50 = (fdb_kvs_handle *)0x1122fc;
  fVar4 = fdb_open(&pfStack_b38,"./mvcc_test1",(fdb_config *)pfVar14);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_b50 = (fdb_kvs_handle *)0x112318;
    fVar4 = fdb_kvs_open_default(pfStack_b38,&pfStack_b40,&fStack_af0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126ac;
    pfStack_b50 = (fdb_kvs_handle *)0x112338;
    fVar4 = fdb_set_log_callback(pfStack_b40,logCallbackFunc,"in_memory_snapshot_cleanup_test");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126b1;
    pcVar20 = (char *)aaStack_a98;
    aaStack_a98[0]._0_4_ = 0x79656b;
    pfVar14 = (fdb_kvs_handle *)&fStack_ab8;
    fStack_ab8._4_1_ = 0;
    fStack_ab8.create_if_missing = true;
    fStack_ab8._1_3_ = 0x617465;
    handle = &fStack_ad8.create_if_missing;
    fStack_ad8._4_1_ = 0;
    fStack_ad8.create_if_missing = true;
    fStack_ad8._1_3_ = 0x79646f;
    pfStack_b50 = (fdb_kvs_handle *)0x11237b;
    unaff_R12 = (char *)strlen(pcVar20);
    pfStack_b50 = (fdb_kvs_handle *)0x112386;
    unaff_R13 = (char *)strlen((char *)pfVar14);
    pfStack_b50 = (fdb_kvs_handle *)0x112391;
    sVar8 = strlen(handle);
    unaff_RBP._M_i = (__int_type)&aStack_b30;
    pfStack_b50 = (fdb_kvs_handle *)0x1123b1;
    in_RCX = pfVar14;
    fdb_doc_create((fdb_doc **)unaff_RBP._M_i,pcVar20,(size_t)unaff_R12,pfVar14,(size_t)unaff_R13,
                   handle,sVar8);
    pfStack_b50 = (fdb_kvs_handle *)0x1123bf;
    fdb_set(pfStack_b40,(fdb_doc *)aStack_b30.seqtree);
    pfStack_b50 = (fdb_kvs_handle *)0x1123cb;
    fdb_commit(pfStack_b38,'\0');
    pfStack_b50 = (fdb_kvs_handle *)0x1123e1;
    fVar4 = fdb_snapshot_open(pfStack_b40,&pfStack_b10,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126b6;
    pfStack_b50 = (fdb_kvs_handle *)0x1123f8;
    fVar4 = fdb_set(pfStack_b40,(fdb_doc *)aStack_b30.seqtree);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126bb;
    pfStack_b50 = (fdb_kvs_handle *)0x11240c;
    fVar4 = fdb_commit(pfStack_b38,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126c0;
    pfStack_b50 = (fdb_kvs_handle *)0x11242a;
    fVar4 = fdb_snapshot_open(pfStack_b40,&pfStack_b18,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126c5;
    pfStack_b50 = (fdb_kvs_handle *)0x112441;
    fVar4 = fdb_set(pfStack_b40,(fdb_doc *)aStack_b30.seqtree);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126ca;
    pfStack_b50 = (fdb_kvs_handle *)0x112455;
    fVar4 = fdb_commit(pfStack_b38,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126cf;
    pfStack_b50 = (fdb_kvs_handle *)0x11246c;
    fVar4 = fdb_set(pfStack_b40,(fdb_doc *)aStack_b30.seqtree);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126d4;
    pfStack_b50 = (fdb_kvs_handle *)0x112480;
    fVar4 = fdb_commit(pfStack_b38,'\0');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126d9;
    pcVar20 = (char *)&aStack_b30;
    pfStack_b50 = (fdb_kvs_handle *)0x112495;
    fdb_doc_free((fdb_doc *)aStack_b30.seqtree);
    pfVar14 = (fdb_kvs_handle *)&fStack_a68;
    fStack_a68.chunksize = 0x654b;
    fStack_a68._2_2_ = 0x79;
    pfStack_b50 = (fdb_kvs_handle *)0x1124ac;
    handle = (char *)strlen((char *)pfVar14);
    unaff_R12 = &fStack_ab8.create_if_missing;
    pfStack_b50 = (fdb_kvs_handle *)0x1124bf;
    unaff_R13 = (char *)strlen(unaff_R12);
    unaff_RBP._M_i = (__int_type)&fStack_ad8;
    pfStack_b50 = (fdb_kvs_handle *)0x1124cf;
    sVar8 = strlen((char *)unaff_RBP._M_i);
    pfStack_b50 = (fdb_kvs_handle *)0x1124ea;
    in_RCX = (fdb_kvs_handle *)unaff_R12;
    fdb_doc_create((fdb_doc **)pcVar20,pfVar14,(size_t)handle,unaff_R12,(size_t)unaff_R13,
                   (void *)unaff_RBP._M_i,sVar8);
    pfStack_b50 = (fdb_kvs_handle *)0x1124f7;
    fdb_set(pfStack_b40,(fdb_doc *)aStack_b30.seqtree);
    pfStack_b50 = (fdb_kvs_handle *)0x11250d;
    fVar4 = fdb_snapshot_open(pfStack_b40,&pfStack_b20,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126de;
    pcVar20 = (char *)aaStack_a98;
    pfStack_b50 = (fdb_kvs_handle *)0x112525;
    sVar8 = strlen(pcVar20);
    pfVar14 = (fdb_kvs_handle *)&pfStack_b28;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_b50 = (fdb_kvs_handle *)0x112548;
    fdb_doc_create((fdb_doc **)pfVar14,pcVar20,sVar8,(void *)0x0,0,(void *)0x0,0);
    pfStack_b50 = (fdb_kvs_handle *)0x112555;
    fVar4 = fdb_get(pfStack_b10,pfStack_b28);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126e3;
    pfStack_b50 = (fdb_kvs_handle *)0x11256c;
    fVar4 = fdb_get(pfStack_b18,pfStack_b28);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126e8;
    pfStack_b50 = (fdb_kvs_handle *)0x112583;
    fVar4 = fdb_get(pfStack_b20,pfStack_b28);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126ed;
    pfStack_b50 = (fdb_kvs_handle *)0x112595;
    fdb_doc_free(pfStack_b28);
    pfStack_b50 = (fdb_kvs_handle *)0x1125a9;
    fVar4 = fdb_snapshot_open(pfStack_b40,&pfStack_af8,1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126f2;
    pfStack_b50 = (fdb_kvs_handle *)0x1125c5;
    fVar4 = fdb_snapshot_open(pfStack_b40,&pfStack_b00,2);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126f7;
    pfStack_b50 = (fdb_kvs_handle *)0x1125e1;
    fVar4 = fdb_snapshot_open(pfStack_b40,&pfStack_b08,3);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001126fc;
    pfStack_b50 = (fdb_kvs_handle *)0x1125f3;
    fdb_kvs_close(pfStack_b10);
    pfStack_b50 = (fdb_kvs_handle *)0x1125fd;
    fdb_kvs_close(pfStack_b18);
    pfStack_b50 = (fdb_kvs_handle *)0x112607;
    fdb_kvs_close(pfStack_b20);
    pfStack_b50 = (fdb_kvs_handle *)0x112616;
    fVar4 = fdb_commit(pfStack_b38,'\x01');
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_b50 = (fdb_kvs_handle *)0x112628;
      fdb_kvs_close(pfStack_af8);
      pfStack_b50 = (fdb_kvs_handle *)0x112632;
      fdb_kvs_close(pfStack_b00);
      pfStack_b50 = (fdb_kvs_handle *)0x11263c;
      fdb_kvs_close(pfStack_b08);
      pfStack_b50 = (fdb_kvs_handle *)0x112646;
      fdb_kvs_close(pfStack_b40);
      pfStack_b50 = (fdb_kvs_handle *)0x112650;
      fdb_close(pfStack_b38);
      pfStack_b50 = (fdb_kvs_handle *)0x11265a;
      fdb_doc_free((fdb_doc *)aStack_b30.seqtree);
      pfStack_b50 = (fdb_kvs_handle *)0x11265f;
      fdb_shutdown();
      pfStack_b50 = (fdb_kvs_handle *)0x112664;
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (in_memory_snapshot_cleanup_test()::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pfStack_b50 = (fdb_kvs_handle *)0x112695;
      fprintf(_stderr,pcVar20,"in-memory snapshot cleanup test");
      return;
    }
  }
  else {
    pfStack_b50 = (fdb_kvs_handle *)0x1126ac;
    in_memory_snapshot_cleanup_test();
LAB_001126ac:
    pfStack_b50 = (fdb_kvs_handle *)0x1126b1;
    in_memory_snapshot_cleanup_test();
LAB_001126b1:
    pfStack_b50 = (fdb_kvs_handle *)0x1126b6;
    in_memory_snapshot_cleanup_test();
LAB_001126b6:
    pfStack_b50 = (fdb_kvs_handle *)0x1126bb;
    in_memory_snapshot_cleanup_test();
LAB_001126bb:
    pfStack_b50 = (fdb_kvs_handle *)0x1126c0;
    in_memory_snapshot_cleanup_test();
LAB_001126c0:
    pfStack_b50 = (fdb_kvs_handle *)0x1126c5;
    in_memory_snapshot_cleanup_test();
LAB_001126c5:
    pfStack_b50 = (fdb_kvs_handle *)0x1126ca;
    in_memory_snapshot_cleanup_test();
LAB_001126ca:
    pfStack_b50 = (fdb_kvs_handle *)0x1126cf;
    in_memory_snapshot_cleanup_test();
LAB_001126cf:
    pfStack_b50 = (fdb_kvs_handle *)0x1126d4;
    in_memory_snapshot_cleanup_test();
LAB_001126d4:
    pfStack_b50 = (fdb_kvs_handle *)0x1126d9;
    in_memory_snapshot_cleanup_test();
LAB_001126d9:
    pfStack_b50 = (fdb_kvs_handle *)0x1126de;
    in_memory_snapshot_cleanup_test();
LAB_001126de:
    pfStack_b50 = (fdb_kvs_handle *)0x1126e3;
    in_memory_snapshot_cleanup_test();
LAB_001126e3:
    pfStack_b50 = (fdb_kvs_handle *)0x1126e8;
    in_memory_snapshot_cleanup_test();
LAB_001126e8:
    pfStack_b50 = (fdb_kvs_handle *)0x1126ed;
    in_memory_snapshot_cleanup_test();
LAB_001126ed:
    pfStack_b50 = (fdb_kvs_handle *)0x1126f2;
    in_memory_snapshot_cleanup_test();
LAB_001126f2:
    pfStack_b50 = (fdb_kvs_handle *)0x1126f7;
    in_memory_snapshot_cleanup_test();
LAB_001126f7:
    pfStack_b50 = (fdb_kvs_handle *)0x1126fc;
    in_memory_snapshot_cleanup_test();
LAB_001126fc:
    pfStack_b50 = (fdb_kvs_handle *)0x112701;
    in_memory_snapshot_cleanup_test();
  }
  pfStack_b50 = (fdb_kvs_handle *)in_memory_snapshot_on_dirty_hbtrie_test;
  in_memory_snapshot_cleanup_test();
  pfStack_f18 = (fdb_kvs_handle *)0x112726;
  paStack_b78 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)pcVar20;
  pfStack_b70 = (fdb_kvs_handle *)unaff_R12;
  pfStack_b68 = (fdb_kvs_handle *)unaff_R13;
  pfStack_b60 = pfVar14;
  pfStack_b58 = (fdb_kvs_handle *)handle;
  pfStack_b50 = (fdb_kvs_handle *)unaff_RBP._M_i;
  gettimeofday(&tStack_e90,(__timezone_ptr_t)0x0);
  pfStack_c80 = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_c78,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_f18 = (fdb_kvs_handle *)0x11274e;
  system((char *)&pfStack_c80);
  pfStack_f18 = (fdb_kvs_handle *)0x112753;
  memleak_start();
  pfStack_f18 = (fdb_kvs_handle *)0x11275d;
  pfVar7 = (fdb_kvs_handle *)malloc(0x20);
  pfVar14 = (fdb_kvs_handle *)(auStack_e80 + 0x108);
  pfStack_f18 = (fdb_kvs_handle *)0x112770;
  fdb_get_default_config();
  uStack_d58._0_1_ = true;
  uStack_d58._1_1_ = true;
  uStack_d60 = '\x01';
  pcStack_d68 = (char *)0x3c;
  uStack_d38 = 1;
  sStack_d70 = 0;
  pfStack_f18 = (fdb_kvs_handle *)0x11279b;
  fdb_get_default_kvs_config();
  pfStack_f18 = (fdb_kvs_handle *)0x1127af;
  fVar4 = fdb_open(&pfStack_ec8,"./mvcc_test",(fdb_config *)pfVar14);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    in_RCX = (fdb_kvs_handle *)(auStack_eb0 + 8);
    pfStack_f18 = (fdb_kvs_handle *)0x1127d2;
    fVar4 = fdb_kvs_open(pfStack_ec8,&pfStack_ee0,"db",(fdb_kvs_config *)in_RCX);
    pcVar20 = (char *)pfVar14;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112fda;
    puStack_ee8 = (undefined4 *)((long)&pfVar7->kvs + 2);
    pcVar20 = "k%05d";
    handle = auStack_e80;
    unaff_R12 = "value%08d";
    unaff_RBP._M_i = 0;
    do {
      pfStack_f18 = (fdb_kvs_handle *)0x11280d;
      sprintf(handle,"k%05d",unaff_RBP._M_i);
      *(undefined4 *)&pfVar7->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar7->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar7->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_ee8 + 1) = 0x3e;
      *puStack_ee8 = 0x646e653c;
      pfStack_f18 = (fdb_kvs_handle *)0x11283b;
      sprintf((char *)pfVar7,"value%08d",unaff_RBP._M_i);
      unaff_R13 = (char *)pfStack_ee0;
      pfStack_f18 = (fdb_kvs_handle *)0x112848;
      sVar8 = strlen(handle);
      pfStack_f18 = (fdb_kvs_handle *)0x112860;
      in_RCX = pfVar7;
      fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle,sVar8 + 1,pfVar7,0x20);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112f50;
      uVar15 = (int)unaff_RBP._M_i + 1;
      unaff_RBP._M_i = (__int_type)uVar15;
    } while (uVar15 != 0x1e);
    pfStack_f18 = (fdb_kvs_handle *)0x11287e;
    fVar4 = fdb_commit(pfStack_ec8,'\x01');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112fdf;
    pfStack_f18 = (fdb_kvs_handle *)0x11289c;
    fVar4 = fdb_snapshot_open(pfStack_ee0,&pfStack_ef0,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112fe4;
    pfStack_f18 = (fdb_kvs_handle *)0x1128ba;
    fVar4 = fdb_snapshot_open(pfStack_ef0,&pfStack_ed8,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112fe9;
    unaff_RBP._M_i = 0x1e;
    pcVar20 = "k%05d";
    handle = auStack_e80;
    unaff_R12 = "value%08d";
    do {
      pfStack_f18 = (fdb_kvs_handle *)0x1128ec;
      sprintf(handle,"k%05d",unaff_RBP._M_i);
      *(undefined4 *)&pfVar7->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar7->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar7->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_ee8 + 1) = 0x3e;
      *puStack_ee8 = 0x646e653c;
      pfStack_f18 = (fdb_kvs_handle *)0x11291a;
      sprintf((char *)pfVar7,"value%08d",unaff_RBP._M_i);
      unaff_R13 = (char *)pfStack_ee0;
      pfStack_f18 = (fdb_kvs_handle *)0x112927;
      sVar8 = strlen(handle);
      pfStack_f18 = (fdb_kvs_handle *)0x11293f;
      in_RCX = pfVar7;
      fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle,sVar8 + 1,pfVar7,0x20);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112f55;
      uVar15 = (int)unaff_RBP._M_i + 1;
      unaff_RBP._M_i = (__int_type)uVar15;
    } while (uVar15 != 300);
    pfStack_f18 = (fdb_kvs_handle *)0x11296f;
    sprintf((char *)auStack_e80,"k%05d",0x1e);
    handle = (char *)pfStack_ef0;
    pfStack_f18 = (fdb_kvs_handle *)0x11297c;
    sVar8 = strlen((char *)auStack_e80);
    in_RCX = (fdb_kvs_handle *)auStack_eb0;
    pfStack_f18 = (fdb_kvs_handle *)0x112995;
    fVar4 = fdb_get_kv((fdb_kvs_handle *)handle,(fdb_kvs_handle *)auStack_e80,sVar8 + 1,
                       (void **)in_RCX,&sStack_eb8);
    pcVar20 = (char *)pfStack_ed8;
    pfVar14 = (fdb_kvs_handle *)auStack_e80;
    if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00112fee;
    handle = auStack_e80;
    pfStack_f18 = (fdb_kvs_handle *)0x1129b2;
    sVar8 = strlen(handle);
    in_RCX = (fdb_kvs_handle *)auStack_eb0;
    pfStack_f18 = (fdb_kvs_handle *)0x1129cb;
    fVar4 = fdb_get_kv((fdb_kvs_handle *)pcVar20,handle,sVar8 + 1,(void **)in_RCX,&sStack_eb8);
    if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00112ff3;
    pfStack_f18 = (fdb_kvs_handle *)0x1129dd;
    fVar4 = fdb_kvs_close(pfStack_ef0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112ff8;
    pfStack_f18 = (fdb_kvs_handle *)0x1129ef;
    fVar4 = fdb_kvs_close(pfStack_ed8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112ffd;
    pfStack_f18 = (fdb_kvs_handle *)0x112a0d;
    fVar4 = fdb_snapshot_open(pfStack_ee0,&pfStack_ef0,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113002;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_f18 = (fdb_kvs_handle *)0x112a35;
    fVar4 = fdb_iterator_init(pfStack_ef0,&pfStack_ef8,(void *)0x0,0,(void *)0x0,0,0);
    pfVar14 = (fdb_kvs_handle *)pcVar20;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113007;
    unaff_R12 = auStack_e80;
    unaff_R13 = "value%08d";
    unaff_RBP._M_i = 0;
    do {
      pfStack_f08 = (fdb_kvs_handle *)0x0;
      pfStack_f18 = (fdb_kvs_handle *)0x112a66;
      fVar4 = fdb_iterator_get(pfStack_ef8,(fdb_doc **)&pfStack_f08);
      pfVar14 = (fdb_kvs_handle *)pcVar20;
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      pfStack_f18 = (fdb_kvs_handle *)0x112a81;
      sprintf(unaff_R12,"k%05d",unaff_RBP._M_i);
      *(undefined4 *)&pfVar7->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar7->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar7->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_ee8 + 1) = 0x3e;
      *puStack_ee8 = 0x646e653c;
      pfStack_f18 = (fdb_kvs_handle *)0x112aaf;
      sprintf((char *)pfVar7,"value%08d",unaff_RBP._M_i);
      pcVar20 = (char *)pfStack_f08;
      handle = (char *)pfStack_f08->op_stats;
      pfStack_f18 = (fdb_kvs_handle *)0x112ac6;
      iVar5 = bcmp(handle,unaff_R12,*(size_t *)&pfStack_f08->kvs_config);
      if (iVar5 != 0) goto LAB_00112f5a;
      handle = (char *)(((fdb_kvs_handle *)pcVar20)->field_6).seqtree;
      pfStack_f18 = (fdb_kvs_handle *)0x112ae1;
      iVar5 = bcmp(handle,pfVar7,(size_t)(((fdb_kvs_handle *)pcVar20)->kvs_config).custom_cmp_param)
      ;
      if (iVar5 != 0) goto LAB_00112f6a;
      unaff_RBP._M_i = (__int_type)((int)unaff_RBP._M_i + 1);
      pfStack_f18 = (fdb_kvs_handle *)0x112af3;
      fdb_doc_free((fdb_doc *)pcVar20);
      pfStack_f18 = (fdb_kvs_handle *)0x112afd;
      fVar4 = fdb_iterator_next(pfStack_ef8);
      pfVar14 = (fdb_kvs_handle *)pcVar20;
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)unaff_RBP._M_i != 300) goto LAB_0011300c;
    pfStack_f18 = (fdb_kvs_handle *)0x112b1b;
    fVar4 = fdb_iterator_close(pfStack_ef8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113011;
    pfStack_f18 = (fdb_kvs_handle *)0x112b39;
    fVar4 = fdb_snapshot_open(pfStack_ef0,&pfStack_ed8,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113016;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_f18 = (fdb_kvs_handle *)0x112b61;
    fVar4 = fdb_iterator_init(pfStack_ef0,&pfStack_ef8,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011301b;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_f18 = (fdb_kvs_handle *)0x112b89;
    fVar4 = fdb_iterator_init(pfStack_ed8,&pfStack_ec0,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113020;
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_f18 = (fdb_kvs_handle *)0x112bb1;
    fVar4 = fdb_iterator_init(pfStack_ee0,&pfStack_ed0,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113025;
    unaff_R12 = auStack_e80;
    unaff_R13 = "value%08d";
    handle = "k%06d";
    uStack_efc = 0;
    do {
      pfStack_f08 = (fdb_kvs_handle *)0x0;
      pfStack_f18 = (fdb_kvs_handle *)0x112bef;
      fVar4 = fdb_iterator_get(pfStack_ef8,(fdb_doc **)&pfStack_f08);
      uVar15 = uStack_efc;
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      pfStack_f18 = (fdb_kvs_handle *)0x112c0e;
      sprintf(unaff_R12,"k%05d",(ulong)uStack_efc);
      *(undefined4 *)&pfVar7->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar7->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar7->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_ee8 + 1) = 0x3e;
      *puStack_ee8 = 0x646e653c;
      pfStack_f18 = (fdb_kvs_handle *)0x112c3c;
      sprintf((char *)pfVar7,"value%08d",(ulong)uVar15);
      pcVar20 = (char *)pfStack_f08;
      unaff_RBP._M_i = (__int_type)pfStack_f08->op_stats;
      pfStack_f18 = (fdb_kvs_handle *)0x112c53;
      iVar5 = bcmp((void *)unaff_RBP._M_i,unaff_R12,*(size_t *)&pfStack_f08->kvs_config);
      if (iVar5 != 0) goto LAB_00112f75;
      unaff_RBP._M_i = (__int_type)(((fdb_kvs_handle *)pcVar20)->field_6).seqtree;
      pfStack_f18 = (fdb_kvs_handle *)0x112c6e;
      iVar5 = bcmp((void *)unaff_RBP._M_i,pfVar7,
                   (size_t)(((fdb_kvs_handle *)pcVar20)->kvs_config).custom_cmp_param);
      pfVar14 = (fdb_kvs_handle *)pcVar20;
      if (iVar5 != 0) goto LAB_00112fa5;
      pfStack_f18 = (fdb_kvs_handle *)0x112c7e;
      fdb_doc_free((fdb_doc *)pcVar20);
      pfStack_f08 = (fdb_kvs_handle *)0x0;
      pfStack_f18 = (fdb_kvs_handle *)0x112c96;
      fVar4 = fdb_iterator_get(pfStack_ef8,(fdb_doc **)&pfStack_f08);
      pfVar14 = pfStack_f08;
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00112f85;
      unaff_RBP._M_i = (__int_type)pfStack_f08->op_stats;
      pfStack_f18 = (fdb_kvs_handle *)0x112cb5;
      iVar5 = bcmp((void *)unaff_RBP._M_i,unaff_R12,*(size_t *)&pfStack_f08->kvs_config);
      if (iVar5 != 0) goto LAB_00112f8a;
      unaff_RBP._M_i = (__int_type)(pfVar14->field_6).seqtree;
      pfStack_f18 = (fdb_kvs_handle *)0x112cd0;
      iVar5 = bcmp((void *)unaff_RBP._M_i,pfVar7,(size_t)(pfVar14->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_00112f9a;
      uVar15 = uStack_efc + 1;
      unaff_RBP._M_i = (__int_type)uVar15;
      pfStack_f18 = (fdb_kvs_handle *)0x112ce6;
      fdb_doc_free((fdb_doc *)pfVar14);
      uStack_efc = uVar15;
      if (uVar15 == 0x3c) {
        pcVar20 = (char *)0x0;
        do {
          pfStack_f18 = (fdb_kvs_handle *)0x112d02;
          sprintf(unaff_R12,"k%06d",pcVar20);
          *(undefined4 *)&pfVar7->kvs_config = 0x78787878;
          *(undefined4 *)&(pfVar7->kvs_config).field_0x4 = 0x78787878;
          *(undefined4 *)&(pfVar7->kvs_config).custom_cmp = 0x78787878;
          *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 4) = 0x78787878;
          *(undefined4 *)&(pfVar7->kvs_config).custom_cmp_param = 0x78787878;
          *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp_param + 4) = 0x78787878;
          *(undefined4 *)&pfVar7->kvs = 0x78787878;
          *(uint32_t *)((long)&pfVar7->kvs + 4) = 0x78787878;
          *(undefined2 *)(puStack_ee8 + 1) = 0x3e;
          *puStack_ee8 = 0x646e653c;
          pfStack_f18 = (fdb_kvs_handle *)0x112d31;
          sprintf((char *)pfVar7,"value%08d",pcVar20);
          unaff_RBP._M_i = (__int_type)pfStack_ee0;
          pfStack_f18 = (fdb_kvs_handle *)0x112d3e;
          sVar8 = strlen(unaff_R12);
          pfStack_f18 = (fdb_kvs_handle *)0x112d56;
          in_RCX = pfVar7;
          fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_RBP._M_i,unaff_R12,sVar8 + 1,pfVar7,0x20);
          if (fVar4 != FDB_RESULT_SUCCESS) {
            pfStack_f18 = (fdb_kvs_handle *)0x112f50;
            in_memory_snapshot_on_dirty_hbtrie_test();
            goto LAB_00112f50;
          }
          uVar15 = (int)pcVar20 + 1;
          pcVar20 = (char *)(ulong)uVar15;
        } while (uVar15 != 3000);
      }
      pfStack_f18 = (fdb_kvs_handle *)0x112d74;
      fVar4 = fdb_iterator_next(pfStack_ef8);
      pfVar14 = (fdb_kvs_handle *)(ulong)(uint)fVar4;
      pfStack_f18 = (fdb_kvs_handle *)0x112d81;
      fVar6 = fdb_iterator_next(pfStack_ec0);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00112fd0;
      }
      else if (fVar6 == FDB_RESULT_SUCCESS) goto LAB_00112fcb;
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if (uStack_efc != 300) goto LAB_0011302a;
    pfStack_f18 = (fdb_kvs_handle *)0x112db8;
    fVar4 = fdb_iterator_close(pfStack_ef8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011302f;
    pfStack_f18 = (fdb_kvs_handle *)0x112dca;
    fVar4 = fdb_iterator_close(pfStack_ec0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113034;
    unaff_R12 = auStack_e80;
    unaff_R13 = "value%08d";
    unaff_RBP._M_i = 0;
    do {
      pfStack_f08 = (fdb_kvs_handle *)0x0;
      pfStack_f18 = (fdb_kvs_handle *)0x112dfb;
      fVar4 = fdb_iterator_get(pfStack_ed0,(fdb_doc **)&pfStack_f08);
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      pfStack_f18 = (fdb_kvs_handle *)0x112e16;
      sprintf(unaff_R12,"k%05d",unaff_RBP._M_i);
      *(undefined4 *)&pfVar7->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar7->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar7->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_ee8 + 1) = 0x3e;
      *puStack_ee8 = 0x646e653c;
      pfStack_f18 = (fdb_kvs_handle *)0x112e44;
      sprintf((char *)pfVar7,"value%08d",unaff_RBP._M_i);
      pfVar14 = pfStack_f08;
      handle = (char *)pfStack_f08->op_stats;
      pfStack_f18 = (fdb_kvs_handle *)0x112e5b;
      iVar5 = bcmp(handle,unaff_R12,*(size_t *)&pfStack_f08->kvs_config);
      if (iVar5 != 0) goto LAB_00112fb0;
      handle = (char *)(pfVar14->field_6).seqtree;
      pfStack_f18 = (fdb_kvs_handle *)0x112e76;
      iVar5 = bcmp(handle,pfVar7,(size_t)(pfVar14->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_00112fc0;
      unaff_RBP._M_i = (__int_type)((int)unaff_RBP._M_i + 1);
      pfStack_f18 = (fdb_kvs_handle *)0x112e88;
      fdb_doc_free((fdb_doc *)pfVar14);
      pfStack_f18 = (fdb_kvs_handle *)0x112e92;
      fVar4 = fdb_iterator_next(pfStack_ed0);
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)unaff_RBP._M_i != 300) goto LAB_00113039;
    pfStack_f18 = (fdb_kvs_handle *)0x112eb0;
    fVar4 = fdb_iterator_close(pfStack_ed0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011303e;
    pfStack_f18 = (fdb_kvs_handle *)0x112ec2;
    fVar4 = fdb_kvs_close(pfStack_ef0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113043;
    pfStack_f18 = (fdb_kvs_handle *)0x112ed4;
    fVar4 = fdb_kvs_close(pfStack_ed8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113048;
    pfStack_f18 = (fdb_kvs_handle *)0x112ee6;
    fVar4 = fdb_close(pfStack_ec8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011304d;
    pfStack_f18 = (fdb_kvs_handle *)0x112ef3;
    fVar4 = fdb_shutdown();
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_f18 = (fdb_kvs_handle *)0x112f03;
      free(pfVar7);
      pfStack_f18 = (fdb_kvs_handle *)0x112f08;
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (in_memory_snapshot_on_dirty_hbtrie_test()::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pfStack_f18 = (fdb_kvs_handle *)0x112f39;
      fprintf(_stderr,pcVar20,"in-memory snapshot on dirty HB+trie nodes test");
      return;
    }
  }
  else {
LAB_00112fd5:
    pfStack_f18 = (fdb_kvs_handle *)0x112fda;
    in_memory_snapshot_on_dirty_hbtrie_test();
    pcVar20 = (char *)pfVar14;
LAB_00112fda:
    pfStack_f18 = (fdb_kvs_handle *)0x112fdf;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fdf:
    pfStack_f18 = (fdb_kvs_handle *)0x112fe4;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fe4:
    pfStack_f18 = (fdb_kvs_handle *)0x112fe9;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fe9:
    pfStack_f18 = (fdb_kvs_handle *)0x112fee;
    in_memory_snapshot_on_dirty_hbtrie_test();
    pfVar14 = (fdb_kvs_handle *)pcVar20;
LAB_00112fee:
    pcVar20 = (char *)pfVar14;
    pfStack_f18 = (fdb_kvs_handle *)0x112ff3;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112ff3:
    pfStack_f18 = (fdb_kvs_handle *)0x112ff8;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112ff8:
    pfStack_f18 = (fdb_kvs_handle *)0x112ffd;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112ffd:
    pfStack_f18 = (fdb_kvs_handle *)0x113002;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113002:
    pfStack_f18 = (fdb_kvs_handle *)0x113007;
    in_memory_snapshot_on_dirty_hbtrie_test();
    pfVar14 = (fdb_kvs_handle *)pcVar20;
LAB_00113007:
    pfStack_f18 = (fdb_kvs_handle *)0x11300c;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011300c:
    pfStack_f18 = (fdb_kvs_handle *)0x113011;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113011:
    pfStack_f18 = (fdb_kvs_handle *)0x113016;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113016:
    pfStack_f18 = (fdb_kvs_handle *)0x11301b;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011301b:
    pfStack_f18 = (fdb_kvs_handle *)0x113020;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113020:
    pfStack_f18 = (fdb_kvs_handle *)0x113025;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113025:
    pfStack_f18 = (fdb_kvs_handle *)0x11302a;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011302a:
    pfStack_f18 = (fdb_kvs_handle *)0x11302f;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011302f:
    pfStack_f18 = (fdb_kvs_handle *)0x113034;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113034:
    pfStack_f18 = (fdb_kvs_handle *)0x113039;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113039:
    pfStack_f18 = (fdb_kvs_handle *)0x11303e;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011303e:
    pfStack_f18 = (fdb_kvs_handle *)0x113043;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113043:
    pfStack_f18 = (fdb_kvs_handle *)0x113048;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113048:
    pfStack_f18 = (fdb_kvs_handle *)0x11304d;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011304d:
    pfStack_f18 = (fdb_kvs_handle *)0x113052;
    in_memory_snapshot_on_dirty_hbtrie_test();
  }
  pfStack_f18 = (fdb_kvs_handle *)in_memory_snapshot_compaction_test;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfStack_1330 = (fdb_kvs_handle *)0x113077;
  pfStack_f40 = pfVar7;
  pfStack_f38 = (fdb_kvs_handle *)unaff_R12;
  pfStack_f30 = (fdb_kvs_handle *)unaff_R13;
  pfStack_f28 = pfVar14;
  pfStack_f20 = (fdb_kvs_handle *)handle;
  pfStack_f18 = (fdb_kvs_handle *)unaff_RBP._M_i;
  gettimeofday(&tStack_1258,(__timezone_ptr_t)0x0);
  auStack_1320._4_2_ = 100;
  auStack_1320._0_4_ = 0x3530256b;
  auStack_12f8._8_2_ = 100;
  auStack_12f8._0_8_ = (fdb_log_callback)0x38302565756c6176;
  builtin_strncpy(acStack_1040,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_1048 = (fdb_kvs_handle *)0x202066722d206d72;
  pfStack_1330 = (fdb_kvs_handle *)0x1130c4;
  system((char *)&pfStack_1048);
  pfStack_1330 = (fdb_kvs_handle *)0x1130c9;
  memleak_start();
  pfStack_1330 = (fdb_kvs_handle *)0x1130d3;
  pfVar7 = (fdb_kvs_handle *)malloc(0x20);
  pfVar14 = (fdb_kvs_handle *)((long)apbStack_1248 + 0x108);
  pfStack_1330 = (fdb_kvs_handle *)0x1130e6;
  fdb_get_default_config();
  uStack_1120 = 0x201;
  auStack_1140[0x18] = '\x01';
  auStack_1140._16_8_ = (fdb_txn *)0x2;
  uStack_1100 = 1;
  auStack_1140._8_8_ = (fdb_log_callback)0x0;
  pcStack_10e8 = cb_inmem_snap;
  uStack_10e0 = 2;
  pfStack_10d8 = (fdb_txn *)auStack_12c8;
  pfStack_1330 = (fdb_kvs_handle *)0x113130;
  fdb_get_default_kvs_config();
  pfStack_1330 = (fdb_kvs_handle *)0x113144;
  fVar4 = fdb_open(&pfStack_1318,"./mvcc_test",(fdb_config *)pfVar14);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    in_RCX = (fdb_kvs_handle *)(auStack_12c8 + 0x28);
    pfStack_1330 = (fdb_kvs_handle *)0x11316a;
    fVar4 = fdb_kvs_open(pfStack_1318,(fdb_kvs_handle **)(auStack_12f8 + 0x10),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113549;
    in_RCX = (fdb_kvs_handle *)(auStack_12c8 + 0x28);
    pfStack_1330 = (fdb_kvs_handle *)0x113190;
    fVar4 = fdb_kvs_open(pfStack_1318,(fdb_kvs_handle **)(auStack_12f8 + 0x18),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011354e;
    auStack_12c8._0_8_ = auStack_12f8._24_8_;
    auStack_12c8._8_8_ = (btree *)0xa;
    auStack_12c8._24_8_ = auStack_1320;
    handle = auStack_12f8;
    auStack_12c8._16_4_ = 0x20;
    pfVar14 = (fdb_kvs_handle *)((long)&pfVar7->kvs + 2);
    unaff_R12 = (char *)apbStack_1248;
    unaff_RBP._M_i = 0;
    auStack_12c8._32_8_ = handle;
    do {
      pfStack_1330 = (fdb_kvs_handle *)0x1131ec;
      sprintf(unaff_R12,auStack_1320,unaff_RBP._M_i);
      *(undefined4 *)&pfVar7->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar7->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar7->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar7->kvs + 4) = 0x78787878;
      *(undefined2 *)((long)&pfVar7->kvs + 6) = 0x3e;
      *(undefined4 *)&pfVar14->kvs_config = 0x646e653c;
      pfStack_1330 = (fdb_kvs_handle *)0x113217;
      sprintf((char *)pfVar7,handle,unaff_RBP._M_i);
      unaff_R13 = (char *)auStack_12f8._16_8_;
      pfStack_1330 = (fdb_kvs_handle *)0x113224;
      sVar8 = strlen(unaff_R12);
      pfStack_1330 = (fdb_kvs_handle *)0x11323c;
      in_RCX = pfVar7;
      fVar4 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,unaff_R12,sVar8 + 1,pfVar7,0x20);
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pfStack_1330 = (fdb_kvs_handle *)0x11350e;
        in_memory_snapshot_compaction_test();
        goto LAB_0011350e;
      }
      uVar15 = (int)unaff_RBP._M_i + 1;
      unaff_RBP._M_i = (__int_type)uVar15;
    } while (uVar15 != 10);
    pfStack_1330 = (fdb_kvs_handle *)0x11325a;
    fVar4 = fdb_commit(pfStack_1318,'\x01');
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113553;
    pfStack_1330 = (fdb_kvs_handle *)0x113273;
    fVar4 = fdb_compact(pfStack_1318,"./mvcc_test2");
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113558;
    pfStack_1330 = (fdb_kvs_handle *)0x113291;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_12f8._16_8_,&pfStack_1308,0xffffffffffffffff
                             );
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011355d;
    pfStack_1330 = (fdb_kvs_handle *)0x1132ab;
    fVar4 = fdb_get_kvs_info(pfStack_1308,(fdb_kvs_info *)&phStack_1288);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113562;
    if (pkStack_1280 != (kvs_ops_stat *)0xb) {
      pfStack_1330 = (fdb_kvs_handle *)0x1132cb;
      in_memory_snapshot_compaction_test();
    }
    in_RCX = (fdb_kvs_handle *)0x0;
    pfStack_1330 = (fdb_kvs_handle *)0x1132eb;
    fVar4 = fdb_iterator_init(pfStack_1308,&pfStack_1300,(void *)0x0,0,(void *)0x0,0,0);
    pfVar12 = (fdb_kvs_handle *)unaff_R13;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113567;
    handle = (char *)apbStack_1248;
    unaff_RBP._M_i = 0;
    do {
      pfStack_1310 = (fdb_kvs_handle *)0x0;
      pfStack_1330 = (fdb_kvs_handle *)0x113315;
      fVar4 = fdb_iterator_get(pfStack_1300,(fdb_doc **)&pfStack_1310);
      unaff_R13 = (char *)pfStack_1310;
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      if ((uint)unaff_RBP._M_i < 10) {
        pfStack_1330 = (fdb_kvs_handle *)0x113333;
        sprintf(handle,auStack_1320,unaff_RBP._M_i);
        *(undefined4 *)&pfVar7->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar7->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)&(pfVar7->kvs_config).custom_cmp = 0x78787878;
        *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp + 4) = 0x78787878;
        *(undefined4 *)&(pfVar7->kvs_config).custom_cmp_param = 0x78787878;
        *(undefined4 *)((long)&(pfVar7->kvs_config).custom_cmp_param + 4) = 0x78787878;
        *(undefined4 *)&pfVar7->kvs = 0x78787878;
        *(uint32_t *)((long)&pfVar7->kvs + 4) = 0x78787878;
        *(undefined2 *)((long)&pfVar7->kvs + 6) = 0x3e;
        *(undefined4 *)&pfVar14->kvs_config = 0x646e653c;
        pfStack_1330 = (fdb_kvs_handle *)0x113360;
        sprintf((char *)pfVar7,auStack_12f8,unaff_RBP._M_i);
        unaff_R13 = (char *)pfStack_1310;
        unaff_R12 = (char *)pfStack_1310->op_stats;
        pfStack_1330 = (fdb_kvs_handle *)0x113378;
        iVar5 = bcmp(unaff_R12,handle,*(size_t *)&pfStack_1310->kvs_config);
        if (iVar5 != 0) goto LAB_00113529;
        unaff_R12 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pfStack_1330 = (fdb_kvs_handle *)0x113393;
        iVar5 = bcmp(unaff_R12,pfVar7,
                     (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_00113539;
      }
      else {
        apbStack_1248[0] = (btreeblk_handle *)0x79656b5f77656e;
        *(undefined8 *)&pfVar7->kvs_config = 0x756c61765f77656e;
        *(undefined2 *)&(pfVar7->kvs_config).custom_cmp = 0x65;
        unaff_R12 = (char *)pfStack_1310->op_stats;
        pfStack_1330 = (fdb_kvs_handle *)0x1133d9;
        iVar5 = bcmp(unaff_R12,handle,*(size_t *)&pfStack_1310->kvs_config);
        if (iVar5 != 0) goto LAB_0011350e;
        unaff_R12 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pfStack_1330 = (fdb_kvs_handle *)0x1133f4;
        iVar5 = bcmp(unaff_R12,pfVar7,
                     (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_0011351e;
      }
      unaff_RBP._M_i = (__int_type)((uint)unaff_RBP._M_i + 1);
      pfStack_1330 = (fdb_kvs_handle *)0x113408;
      fdb_doc_free((fdb_doc *)pfStack_1310);
      pfStack_1330 = (fdb_kvs_handle *)0x113412;
      fVar4 = fdb_iterator_next(pfStack_1300);
      pfVar12 = (fdb_kvs_handle *)unaff_R13;
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)unaff_RBP._M_i != 0xb) goto LAB_0011356c;
    pfStack_1330 = (fdb_kvs_handle *)0x11342d;
    fVar4 = fdb_iterator_close(pfStack_1300);
    _Var11._M_i = (__int_type)pfStack_1308;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113571;
    handle = (char *)apbStack_1248;
    pfStack_1330 = (fdb_kvs_handle *)0x11344a;
    sVar8 = strlen(handle);
    in_RCX = (fdb_kvs_handle *)(auStack_12f8 + 0x28);
    pfStack_1330 = (fdb_kvs_handle *)0x113463;
    fVar4 = fdb_get_kv((fdb_kvs_handle *)_Var11._M_i,handle,sVar8 + 1,(void **)in_RCX,
                       (size_t *)(auStack_12f8 + 0x20));
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113576;
    pfStack_1330 = (fdb_kvs_handle *)0x113480;
    _Var17._M_i = (__int_type)pfVar7;
    iVar5 = bcmp((void *)auStack_12f8._40_8_,pfVar7,auStack_12f8._32_8_);
    _Var11._M_i = auStack_12f8._40_8_;
    if (iVar5 != 0) goto LAB_0011357b;
    pfStack_1330 = (fdb_kvs_handle *)0x113490;
    fdb_free_block((void *)auStack_12f8._40_8_);
    pfStack_1330 = (fdb_kvs_handle *)0x11349a;
    fdb_kvs_close(pfStack_1308);
    pfStack_1330 = (fdb_kvs_handle *)0x1134a4;
    fVar4 = fdb_close(pfStack_1318);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113586;
    pfStack_1330 = (fdb_kvs_handle *)0x1134b1;
    fVar4 = fdb_shutdown();
    if (fVar4 == FDB_RESULT_SUCCESS) {
      pfStack_1330 = (fdb_kvs_handle *)0x1134c1;
      free(pfVar7);
      pfStack_1330 = (fdb_kvs_handle *)0x1134c6;
      memleak_end();
      pcVar20 = "%s PASSED\n";
      if (in_memory_snapshot_compaction_test()::__test_pass != '\0') {
        pcVar20 = "%s FAILED\n";
      }
      pfStack_1330 = (fdb_kvs_handle *)0x1134f7;
      fprintf(_stderr,pcVar20,"in-memory snapshot with concurrent compaction test");
      return;
    }
  }
  else {
LAB_00113544:
    pfStack_1330 = (fdb_kvs_handle *)0x113549;
    in_memory_snapshot_compaction_test();
LAB_00113549:
    pfStack_1330 = (fdb_kvs_handle *)0x11354e;
    in_memory_snapshot_compaction_test();
LAB_0011354e:
    pfStack_1330 = (fdb_kvs_handle *)0x113553;
    in_memory_snapshot_compaction_test();
LAB_00113553:
    pfStack_1330 = (fdb_kvs_handle *)0x113558;
    in_memory_snapshot_compaction_test();
LAB_00113558:
    pfStack_1330 = (fdb_kvs_handle *)0x11355d;
    in_memory_snapshot_compaction_test();
LAB_0011355d:
    pfStack_1330 = (fdb_kvs_handle *)0x113562;
    in_memory_snapshot_compaction_test();
LAB_00113562:
    pfStack_1330 = (fdb_kvs_handle *)0x113567;
    in_memory_snapshot_compaction_test();
    pfVar12 = (fdb_kvs_handle *)unaff_R13;
LAB_00113567:
    pfStack_1330 = (fdb_kvs_handle *)0x11356c;
    in_memory_snapshot_compaction_test();
LAB_0011356c:
    pfStack_1330 = (fdb_kvs_handle *)0x113571;
    in_memory_snapshot_compaction_test();
LAB_00113571:
    _Var11._M_i = (__int_type)pfVar14;
    pfStack_1330 = (fdb_kvs_handle *)0x113576;
    in_memory_snapshot_compaction_test();
LAB_00113576:
    pfStack_1330 = (fdb_kvs_handle *)0x11357b;
    in_memory_snapshot_compaction_test();
LAB_0011357b:
    pfStack_1330 = (fdb_kvs_handle *)0x113586;
    _Var17._M_i = _Var11._M_i;
    in_memory_snapshot_compaction_test();
LAB_00113586:
    pfStack_1330 = (fdb_kvs_handle *)0x11358b;
    in_memory_snapshot_compaction_test();
  }
  pfStack_1330 = (fdb_kvs_handle *)cb_inmem_snap;
  in_memory_snapshot_compaction_test();
  uVar21 = _Var17._M_i & 0xffffffff;
  pfVar14 = (fdb_kvs_handle *)0x0;
  pcStack_15e8 = (code *)0x1135b8;
  pfStack_1358 = pfVar7;
  pfStack_1350 = (fdb_kvs_handle *)unaff_R12;
  pfStack_1348 = pfVar12;
  pfStack_1340 = (fdb_kvs_handle *)_Var11._M_i;
  pfStack_1338 = (fdb_kvs_handle *)handle;
  pfStack_1330 = (fdb_kvs_handle *)unaff_RBP._M_i;
  gettimeofday((timeval *)auStack_1570,(__timezone_ptr_t)0x0);
  if ((int)_Var17._M_i != 2) {
    return;
  }
  pfVar7 = extraout_RDX;
  if (extraout_RDX == (fdb_kvs_handle *)0x0) {
LAB_00113ad8:
    pcStack_15e8 = (code *)0x113add;
    cb_inmem_snap();
LAB_00113add:
    pcStack_15e8 = (code *)0x113ae2;
    cb_inmem_snap();
LAB_00113ae2:
    pcStack_15e8 = (code *)0x113ae7;
    cb_inmem_snap();
LAB_00113ae7:
    pcStack_15e8 = (code *)0x113aec;
    cb_inmem_snap();
LAB_00113aec:
    pcStack_15e8 = (code *)0x113af1;
    cb_inmem_snap();
LAB_00113af1:
    pcStack_15e8 = (code *)0x113af6;
    cb_inmem_snap();
LAB_00113af6:
    pcStack_15e8 = (code *)0x113afb;
    cb_inmem_snap();
    pfVar13 = pfVar7;
LAB_00113afb:
    pcStack_15e8 = (code *)0x113b00;
    cb_inmem_snap();
LAB_00113b00:
    pfVar7 = in_RCX;
    pcStack_15e8 = (code *)0x113b05;
    cb_inmem_snap();
LAB_00113b05:
    pcStack_15e8 = (code *)0x113b0a;
    cb_inmem_snap();
  }
  else {
    pfVar7 = (fdb_kvs_handle *)
             CONCAT26(auStack_1320._6_2_,CONCAT24(auStack_1320._4_2_,auStack_1320._0_4_));
    pfVar14 = (fdb_kvs_handle *)(ulong)*(byte *)&in_RCX->file;
    iVar5 = *(int *)((long)&(pfVar7->kvs_config).custom_cmp + 4);
    *(int *)((long)&(pfVar7->kvs_config).custom_cmp + 4) = iVar5 + 1;
    if (iVar5 != 4) {
      if (iVar5 != 1) {
        return;
      }
      pcStack_15e8 = (code *)0x113607;
      fVar4 = fdb_snapshot_open(*(fdb_kvs_handle **)&pfVar7->kvs_config,&pfStack_15c8,
                                0xffffffffffffffff);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113add;
      pcStack_15e8 = (code *)0x11361e;
      fVar4 = fdb_get_kvs_info(pfStack_15c8,&fStack_15a0);
      if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113ae7;
      in_RCX = (fdb_kvs_handle *)&(pfVar7->kvs_config).custom_cmp;
      if (fStack_15a0.last_seqnum != (long)*(int *)&(pfVar7->kvs_config).custom_cmp) {
        pcStack_15e8 = (code *)0x113a46;
        cb_inmem_snap();
      }
      pcStack_15e8 = (code *)0x113663;
      pfStack_15c0 = pfVar14;
      pp_Stack_15b8 = (fdb_custom_cmp_variable *)in_RCX;
      fVar4 = fdb_iterator_init(pfStack_15c8,&pfStack_15d0,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar4 == FDB_RESULT_SUCCESS) {
        pfVar7 = (fdb_kvs_handle *)(auStack_1570 + 10);
        pcVar20 = auStack_1566 + 6;
        uVar21 = 0;
        do {
          pfStack_15d8 = (fdb_kvs_handle *)0x0;
          pcStack_15e8 = (code *)0x11369a;
          fVar4 = fdb_iterator_get(pfStack_15d0,(fdb_doc **)&pfStack_15d8);
          if (fVar4 != FDB_RESULT_SUCCESS) break;
          lVar19 = CONCAT26(auStack_1320._6_2_,CONCAT24(auStack_1320._4_2_,auStack_1320._0_4_));
          pcStack_15e8 = (code *)0x1136ba;
          sprintf((char *)afStack_1460,*(char **)(lVar19 + 0x18),uVar21);
          sVar8 = (size_t)*(int *)(lVar19 + 0x10);
          pcStack_15e8 = (code *)0x1136ce;
          memset(pcVar20,0x78,sVar8);
          *(undefined4 *)(&(pfVar7->kvs_config).create_if_missing + sVar8) = 0x646e653c;
          *(undefined2 *)(auStack_1566 + sVar8 + 4) = 0x3e;
          pcStack_15e8 = (code *)0x1136ee;
          sprintf(pcVar20,*(char **)(lVar19 + 0x20),uVar21);
          pfVar12 = pfStack_15d8;
          in_RCX = (fdb_kvs_handle *)pfStack_15d8->op_stats;
          pcStack_15e8 = (code *)0x113706;
          iVar5 = bcmp(in_RCX,afStack_1460,*(size_t *)&pfStack_15d8->kvs_config);
          if (iVar5 != 0) {
            pcStack_15e8 = (code *)0x113a88;
            cb_inmem_snap();
LAB_00113a88:
            pcStack_15e8 = (code *)0x113a98;
            cb_inmem_snap();
            goto LAB_00113a98;
          }
          in_RCX = (fdb_kvs_handle *)(pfVar12->field_6).seqtree;
          pcStack_15e8 = (code *)0x113721;
          iVar5 = bcmp(in_RCX,pcVar20,(size_t)(pfVar12->kvs_config).custom_cmp_param);
          if (iVar5 != 0) goto LAB_00113a88;
          uVar21 = (ulong)((int)uVar21 + 1);
          pcStack_15e8 = (code *)0x113733;
          fdb_doc_free((fdb_doc *)pfVar12);
          pcStack_15e8 = (code *)0x11373d;
          fVar4 = fdb_iterator_next(pfStack_15d0);
        } while (fVar4 == FDB_RESULT_SUCCESS);
        if ((int)uVar21 != *(int *)pp_Stack_15b8) {
          pcStack_15e8 = (code *)0x113a64;
          cb_inmem_snap();
        }
        pcStack_15e8 = (code *)0x11375c;
        fVar4 = fdb_iterator_close(pfStack_15d0);
        pfVar14 = pfStack_15c0;
        if (fVar4 == FDB_RESULT_SUCCESS) goto LAB_00113a19;
        pcStack_15e8 = (code *)0x11376e;
        cb_inmem_snap();
        goto LAB_0011376e;
      }
      goto LAB_00113af1;
    }
LAB_0011376e:
    pfStack_15c0 = pfVar14;
    in_RCX = (fdb_kvs_handle *)afStack_1460;
    afStack_1460[0].algorithm = 0x5f77656e;
    builtin_memcpy(&afStack_1460[0].algorithm,"key",4);
    pfVar12 = (fdb_kvs_handle *)(auStack_1566 + 6);
    auStack_1566._6_8_ = 0x756c61765f77656e;
    uStack_1558 = 0x65;
    pfVar14 = *(fdb_kvs_handle **)&pfVar7->kvs_config;
    pcStack_15e8 = (code *)0x1137b0;
    sVar8 = strlen((char *)in_RCX);
    unaff_R12 = (char *)(sVar8 + 1);
    pcStack_15e8 = (code *)0x1137bc;
    sVar8 = strlen((char *)pfVar12);
    pcStack_15e8 = (code *)0x1137d1;
    fVar4 = fdb_set_kv(pfVar14,in_RCX,(size_t)unaff_R12,pfVar12,sVar8 + 1);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113ae2;
    pcStack_15e8 = (code *)0x1137ed;
    fVar4 = fdb_snapshot_open(*(fdb_kvs_handle **)&pfVar7->kvs_config,&pfStack_15c8,
                              0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113aec;
    pcStack_15e8 = (code *)0x113804;
    fVar4 = fdb_get_kvs_info(pfStack_15c8,&fStack_15a0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113af6;
    in_RCX = (fdb_kvs_handle *)&(pfVar7->kvs_config).custom_cmp;
    if (fStack_15a0.last_seqnum != (long)*(int *)&(pfVar7->kvs_config).custom_cmp + 1U) {
      pcStack_15e8 = (code *)0x113a58;
      cb_inmem_snap();
    }
    pcStack_15e8 = (code *)0x113842;
    fVar4 = fdb_iterator_init(pfStack_15c8,&pfStack_15d0,(void *)0x0,0,(void *)0x0,0,0);
    pfVar13 = pfVar7;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113afb;
    unaff_R12 = auStack_1566 + 6;
    uVar21 = 0;
    do {
      pfStack_15d8 = (fdb_kvs_handle *)0x0;
      pcStack_15e8 = (code *)0x113874;
      fVar4 = fdb_iterator_get(pfStack_15d0,(fdb_doc **)&pfStack_15d8);
      pfVar7 = pfStack_15d8;
      if (fVar4 != FDB_RESULT_SUCCESS) break;
      if ((int)uVar21 < *(int *)in_RCX) {
        lVar19 = CONCAT26(auStack_1320._6_2_,CONCAT24(auStack_1320._4_2_,auStack_1320._0_4_));
        pcStack_15e8 = (code *)0x11389c;
        sprintf((char *)afStack_1460,*(char **)(lVar19 + 0x18),uVar21);
        sVar8 = (size_t)*(int *)(lVar19 + 0x10);
        pcStack_15e8 = (code *)0x1138b0;
        memset(unaff_R12,0x78,sVar8);
        *(undefined4 *)(auStack_1570 + sVar8 + 10) = 0x646e653c;
        *(undefined2 *)(auStack_1566 + sVar8 + 4) = 0x3e;
        pcStack_15e8 = (code *)0x1138d5;
        sprintf(unaff_R12,*(char **)(lVar19 + 0x20),uVar21);
        pfVar7 = pfStack_15d8;
        pfVar12 = (fdb_kvs_handle *)pfStack_15d8->op_stats;
        pcStack_15e8 = (code *)0x1138ec;
        iVar5 = bcmp(pfVar12,afStack_1460,*(size_t *)&pfStack_15d8->kvs_config);
        if (iVar5 != 0) goto LAB_00113aa8;
        pfVar12 = (fdb_kvs_handle *)(pfVar7->field_6).seqtree;
        pcStack_15e8 = (code *)0x113907;
        iVar5 = bcmp(pfVar12,unaff_R12,(size_t)(pfVar7->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_00113ab8;
      }
      else {
        afStack_1460[0].algorithm = 0x5f77656e;
        builtin_memcpy(&afStack_1460[0].algorithm,"key",4);
        auStack_1566._6_8_ = 0x756c61765f77656e;
        uStack_1558 = 0x65;
        pfVar12 = (fdb_kvs_handle *)pfStack_15d8->op_stats;
        pcStack_15e8 = (code *)0x113955;
        iVar5 = bcmp(pfVar12,afStack_1460,*(size_t *)&pfStack_15d8->kvs_config);
        if (iVar5 != 0) goto LAB_00113ac8;
        pfVar12 = (fdb_kvs_handle *)(pfVar7->field_6).seqtree;
        pcStack_15e8 = (code *)0x113970;
        iVar5 = bcmp(pfVar12,unaff_R12,(size_t)(pfVar7->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_00113a98;
      }
      uVar21 = (ulong)((int)uVar21 + 1);
      pcStack_15e8 = (code *)0x113984;
      fdb_doc_free((fdb_doc *)pfStack_15d8);
      pcStack_15e8 = (code *)0x11398e;
      fVar4 = fdb_iterator_next(pfStack_15d0);
      pfVar13 = pfVar7;
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)uVar21 != *(int *)in_RCX + 1) {
      pcStack_15e8 = (code *)0x113a73;
      cb_inmem_snap();
    }
    pcStack_15e8 = (code *)0x1139ac;
    fVar4 = fdb_iterator_close(pfStack_15d0);
    pfVar14 = pfStack_15c0;
    pfVar7 = pfStack_15c8;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113b00;
    pfVar13 = (fdb_kvs_handle *)afStack_1460;
    pcStack_15e8 = (code *)0x1139ce;
    sVar8 = strlen((char *)pfVar13);
    pcStack_15e8 = (code *)0x1139e7;
    fVar4 = fdb_get_kv(pfVar7,pfVar13,sVar8 + 1,&pfStack_15a8,&sStack_15b0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113b05;
    pcStack_15e8 = (code *)0x113a09;
    iVar5 = bcmp(pfStack_15a8,auStack_1566 + 6,sStack_15b0);
    pfVar7 = pfStack_15a8;
    if (iVar5 == 0) {
      pcStack_15e8 = (code *)0x113a19;
      fdb_free_block(pfStack_15a8);
LAB_00113a19:
      pcStack_15e8 = (code *)0x113a23;
      fdb_kvs_close(pfStack_15c8);
      return;
    }
  }
  pcStack_15e8 = snapshot_clone_test;
  cb_inmem_snap();
  pfStack_1b60 = (fdb_iterator *)0x113b3a;
  fStack_1808.bub_ctx.space_used = (uint64_t)pfVar7;
  fStack_1808.bub_ctx.handle = (fdb_kvs_handle *)unaff_R12;
  pfStack_1600 = pfVar12;
  pfStack_15f8 = pfVar13;
  pfStack_15f0 = pfVar14;
  pcStack_15e8 = (code *)uVar21;
  gettimeofday(&tStack_1a30,(__timezone_ptr_t)0x0);
  pfStack_1b60 = (fdb_iterator *)0x113b3f;
  memleak_start();
  pfStack_1b60 = (fdb_iterator *)0x113b4e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar7 = (fdb_kvs_handle *)&fStack_1808.config.encryption_key;
  pfStack_1b60 = (fdb_iterator *)0x113b5e;
  fdb_get_default_config();
  config = (fdb_iterator *)auStack_1a20;
  pfStack_1b60 = (fdb_iterator *)0x113b6e;
  fdb_get_default_kvs_config();
  fStack_1808.config.encryption_key.bytes[4] = '\0';
  fStack_1808.config.encryption_key.bytes[5] = '\0';
  fStack_1808.config.encryption_key.bytes[6] = '\0';
  fStack_1808.config.encryption_key.bytes[7] = '\0';
  fStack_1808.config.encryption_key.bytes[8] = '\0';
  fStack_1808.config.encryption_key.bytes[9] = '\0';
  fStack_1808.config.encryption_key.bytes[10] = '\0';
  fStack_1808.config.encryption_key.bytes[0xb] = '\0';
  fStack_1808.config.encryption_key.bytes[0xc] = '\0';
  fStack_1808.config.encryption_key.bytes[0xd] = '\x04';
  fStack_1808.config.encryption_key.bytes[0xe] = '\0';
  fStack_1808.config.encryption_key.bytes[0xf] = '\0';
  fStack_1808.config.encryption_key.bytes[0x10] = '\0';
  fStack_1808.config.encryption_key.bytes[0x11] = '\0';
  fStack_1808.config.encryption_key.bytes[0x12] = '\0';
  fStack_1808.config.encryption_key.bytes[0x13] = '\0';
  fStack_1808.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_1808.config._180_4_ = 1;
  fStack_1808.config.block_reusing_threshold._7_1_ = 0;
  pfStack_1b60 = (fdb_iterator *)0x113b98;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar14 = (fdb_kvs_handle *)(auStack_1b40 + 0x10);
  pfStack_1b60 = (fdb_iterator *)0x113baf;
  fVar4 = fdb_open((fdb_file_handle **)pfVar14,"./mvcc_test1",(fdb_config *)pfVar7);
  doc_00 = (fdb_iterator *)(ulong)(uint)fVar4;
  pfStack_1b60 = (fdb_iterator *)0x113bc1;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1b40._16_8_,&pfStack_1b50,(fdb_kvs_config *)config);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_1b60 = (fdb_iterator *)0x113bda;
    fVar4 = fdb_snapshot_open(pfStack_1b50,(fdb_kvs_handle **)(auStack_1b40 + 8),0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114595;
    pfStack_1b60 = (fdb_iterator *)0x113bf4;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1b40._8_8_,(fdb_kvs_info *)(apfStack_1a90 + 6));
    if ((fdb_kvs_handle *)fStack_1a60.last_seqnum != (fdb_kvs_handle *)0x0) {
      pfStack_1b60 = (fdb_iterator *)0x113c07;
      snapshot_clone_test();
    }
    pfVar14 = (fdb_kvs_handle *)auStack_1b40;
    pfStack_1b60 = (fdb_iterator *)0x113c2a;
    fdb_iterator_init((fdb_kvs_handle *)auStack_1b40._8_8_,(fdb_iterator **)pfVar14,(void *)0x0,0,
                      (void *)0x0,0,0);
    pfStack_1b60 = (fdb_iterator *)0x113c32;
    fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1b40._0_8_);
    pfVar13 = (fdb_kvs_handle *)unaff_R12;
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011459a;
    pfStack_1b60 = (fdb_iterator *)0x113c45;
    fdb_iterator_close((fdb_iterator *)auStack_1b40._0_8_);
    pfStack_1b60 = (fdb_iterator *)0x113c4f;
    fdb_kvs_close((fdb_kvs_handle *)auStack_1b40._8_8_);
    lVar19 = 0;
    uVar21 = 0;
    do {
      pfStack_1b60 = (fdb_iterator *)0x113c71;
      sprintf(auStack_1a20 + 0x18,"key%d",uVar21 & 0xffffffff);
      pfStack_1b60 = (fdb_iterator *)0x113c8d;
      sprintf((char *)&fStack_1908,"meta%d",uVar21 & 0xffffffff);
      pfStack_1b60 = (fdb_iterator *)0x113ca9;
      sprintf((char *)&fStack_1808,"body%d",uVar21 & 0xffffffff);
      pfStack_1b60 = (fdb_iterator *)0x113cb9;
      sVar8 = strlen(auStack_1a20 + 0x18);
      pfStack_1b60 = (fdb_iterator *)0x113cc4;
      sVar9 = strlen((char *)&fStack_1908);
      pfStack_1b60 = (fdb_iterator *)0x113ccf;
      sVar10 = strlen((char *)&fStack_1808);
      pfStack_1b60 = (fdb_iterator *)0x113cf4;
      fdb_doc_create((fdb_doc **)(auStack_1b08 + lVar19),auStack_1a20 + 0x18,sVar8,&fStack_1908,
                     sVar9,&fStack_1808,sVar10);
      pfStack_1b60 = (fdb_iterator *)0x113d03;
      fdb_set(pfStack_1b50,*(fdb_doc **)(auStack_1b08 + uVar21 * 8));
      uVar21 = uVar21 + 1;
      lVar19 = lVar19 + 8;
    } while (uVar21 != 5);
    pfStack_1b60 = (fdb_iterator *)0x113d23;
    fdb_commit((fdb_file_handle *)auStack_1b40._16_8_,'\x01');
    uVar21 = 5;
    ppfVar23 = (fdb_doc **)(auStack_1b08 + 0x28);
    do {
      pfStack_1b60 = (fdb_iterator *)0x113d4a;
      sprintf(auStack_1a20 + 0x18,"key%d",uVar21 & 0xffffffff);
      pfStack_1b60 = (fdb_iterator *)0x113d66;
      sprintf((char *)&fStack_1908,"meta%d",uVar21 & 0xffffffff);
      pfStack_1b60 = (fdb_iterator *)0x113d82;
      sprintf((char *)&fStack_1808,"body%d",uVar21 & 0xffffffff);
      pfStack_1b60 = (fdb_iterator *)0x113d8a;
      sVar8 = strlen(auStack_1a20 + 0x18);
      pfStack_1b60 = (fdb_iterator *)0x113d95;
      sVar9 = strlen((char *)&fStack_1908);
      pfStack_1b60 = (fdb_iterator *)0x113da0;
      sVar10 = strlen((char *)&fStack_1808);
      pfStack_1b60 = (fdb_iterator *)0x113dc0;
      fdb_doc_create(ppfVar23,auStack_1a20 + 0x18,sVar8,&fStack_1908,sVar9,&fStack_1808,sVar10);
      pfStack_1b60 = (fdb_iterator *)0x113dcd;
      fdb_set(pfStack_1b50,*ppfVar23);
      uVar21 = uVar21 + 1;
      ppfVar23 = ppfVar23 + 1;
    } while (uVar21 != 9);
    pfVar7 = (fdb_kvs_handle *)(auStack_1a20 + 0x18);
    pfStack_1b60 = (fdb_iterator *)0x113dfc;
    sprintf((char *)pfVar7,"key%d",9);
    config = &fStack_1908;
    pfStack_1b60 = (fdb_iterator *)0x113e1a;
    sprintf((char *)config,"meta%d",9);
    pfVar13 = &fStack_1808;
    pfStack_1b60 = (fdb_iterator *)0x113e38;
    sprintf((char *)pfVar13,"Body%d",9);
    pfVar14 = (fdb_kvs_handle *)(auStack_1b08 + 0x48);
    pfStack_1b60 = (fdb_iterator *)0x113e48;
    pfVar12 = (fdb_kvs_handle *)strlen((char *)pfVar7);
    pfStack_1b60 = (fdb_iterator *)0x113e53;
    doc_00 = (fdb_iterator *)strlen((char *)config);
    pfStack_1b60 = (fdb_iterator *)0x113e5e;
    sVar8 = strlen((char *)pfVar13);
    pfStack_1b60 = (fdb_iterator *)0x113e79;
    fdb_doc_create((fdb_doc **)pfVar14,pfVar7,(size_t)pfVar12,config,(size_t)doc_00,pfVar13,sVar8);
    pfStack_1b60 = (fdb_iterator *)0x113e86;
    fdb_set(pfStack_1b50,(fdb_doc *)auStack_1b08._72_8_);
    pfStack_1b60 = (fdb_iterator *)0x113e92;
    fdb_commit((fdb_file_handle *)auStack_1b40._16_8_,'\0');
    **(undefined1 **)(auStack_1b08._72_8_ + 0x40) = 0x62;
    pfStack_1b60 = (fdb_iterator *)0x113ea9;
    fdb_set(pfStack_1b50,(fdb_doc *)auStack_1b08._72_8_);
    pfStack_1b60 = (fdb_iterator *)0x113eb5;
    fdb_commit((fdb_file_handle *)auStack_1b40._16_8_,'\0');
    pfStack_1b20 = *(fdb_kvs_handle **)(auStack_1b08._72_8_ + 0x28);
    pfStack_1b60 = (fdb_iterator *)0x113ed7;
    fVar4 = fdb_snapshot_open(pfStack_1b50,&pfStack_1b10,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011459f;
    pfStack_1b60 = (fdb_iterator *)0x113ef1;
    fdb_set(pfStack_1b50,(fdb_doc *)auStack_1b08._72_8_);
    pfStack_1b60 = (fdb_iterator *)0x113efd;
    fdb_commit((fdb_file_handle *)auStack_1b40._16_8_,'\0');
    uVar21 = 10;
    pfVar14 = (fdb_kvs_handle *)0x50;
    do {
      pfStack_1b60 = (fdb_iterator *)0x113f24;
      sprintf(auStack_1a20 + 0x18,"key%d",uVar21 & 0xffffffff);
      pfStack_1b60 = (fdb_iterator *)0x113f40;
      sprintf((char *)&fStack_1908,"meta%d",uVar21 & 0xffffffff);
      pfVar13 = &fStack_1808;
      pfStack_1b60 = (fdb_iterator *)0x113f5c;
      sprintf((char *)pfVar13,"body%d",uVar21 & 0xffffffff);
      doc_00 = (fdb_iterator *)(auStack_1b08 + (long)pfVar14);
      pfStack_1b60 = (fdb_iterator *)0x113f6c;
      pfVar7 = (fdb_kvs_handle *)strlen(auStack_1a20 + 0x18);
      pfStack_1b60 = (fdb_iterator *)0x113f77;
      pfVar12 = (fdb_kvs_handle *)strlen((char *)&fStack_1908);
      pfStack_1b60 = (fdb_iterator *)0x113f82;
      sVar8 = strlen((char *)pfVar13);
      pfStack_1b60 = (fdb_iterator *)0x113fa7;
      fdb_doc_create((fdb_doc **)doc_00,auStack_1a20 + 0x18,(size_t)pfVar7,&fStack_1908,
                     (size_t)pfVar12,pfVar13,sVar8);
      pfStack_1b60 = (fdb_iterator *)0x113fb6;
      fdb_set(pfStack_1b50,*(fdb_doc **)(auStack_1b08 + uVar21 * 8));
      uVar21 = uVar21 + 1;
      pfVar14 = (fdb_kvs_handle *)((long)pfVar14 + 8);
    } while (uVar21 != 0xf);
    pfStack_1b60 = (fdb_iterator *)0x113fd6;
    fdb_commit((fdb_file_handle *)auStack_1b40._16_8_,'\x01');
    pfStack_1b60 = (fdb_iterator *)0x113fee;
    fVar4 = fdb_set_log_callback(pfStack_1b50,logCallbackFunc,"snapshot_clone_test");
    config = (fdb_iterator *)0xf;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145a4;
    pfStack_1b60 = (fdb_iterator *)0x11400a;
    fVar4 = fdb_snapshot_open(pfStack_1b50,(fdb_kvs_handle **)(auStack_1b40 + 8),999999);
    pfVar7 = pfStack_1b20;
    if (fVar4 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_001145a9;
    pfStack_1b60 = (fdb_iterator *)0x11402a;
    fVar4 = fdb_snapshot_open(pfStack_1b50,(fdb_kvs_handle **)(auStack_1b40 + 8),
                              (fdb_seqnum_t)pfStack_1b20);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145ae;
    pfStack_1b60 = (fdb_iterator *)0x114044;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1b40._8_8_,&pfStack_1b28,
                              (fdb_seqnum_t)pfVar7);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145b3;
    pfStack_1b60 = (fdb_iterator *)0x114056;
    fVar4 = fdb_kvs_close((fdb_kvs_handle *)auStack_1b40._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145b8;
    pfStack_1b60 = (fdb_iterator *)0x114073;
    fdb_get_kvs_info(pfStack_1b28,(fdb_kvs_info *)(apfStack_1a90 + 6));
    if ((fdb_kvs_handle *)fStack_1a60.last_seqnum != pfVar7) {
      pfStack_1b60 = (fdb_iterator *)0x114089;
      snapshot_clone_test();
    }
    uVar21 = 0xf;
    config = (fdb_iterator *)apfStack_1a90;
    do {
      pfStack_1b60 = (fdb_iterator *)0x1140b1;
      sprintf(auStack_1a20 + 0x18,"key%d",uVar21 & 0xffffffff);
      doc_00 = &fStack_1908;
      pfStack_1b60 = (fdb_iterator *)0x1140cc;
      sprintf((char *)doc_00,"meta%d",uVar21 & 0xffffffff);
      pfVar7 = &fStack_1808;
      pfStack_1b60 = (fdb_iterator *)0x1140e7;
      sprintf((char *)pfVar7,"body%d",uVar21 & 0xffffffff);
      pfStack_1b60 = (fdb_iterator *)0x1140ef;
      pfVar13 = (fdb_kvs_handle *)strlen(auStack_1a20 + 0x18);
      pfStack_1b60 = (fdb_iterator *)0x1140fa;
      pfVar12 = (fdb_kvs_handle *)strlen((char *)doc_00);
      pfStack_1b60 = (fdb_iterator *)0x114105;
      sVar8 = strlen((char *)pfVar7);
      pfStack_1b60 = (fdb_iterator *)0x114125;
      fdb_doc_create((fdb_doc **)config,auStack_1a20 + 0x18,(size_t)pfVar13,doc_00,(size_t)pfVar12,
                     pfVar7,sVar8);
      pfStack_1b60 = (fdb_iterator *)0x114132;
      fdb_set(pfStack_1b50,*(fdb_doc **)config);
      uVar21 = uVar21 + 1;
      config = (fdb_iterator *)((long)config + 8);
    } while (uVar21 != 0x14);
    pfStack_1b60 = (fdb_iterator *)0x11414f;
    fdb_commit((fdb_file_handle *)auStack_1b40._16_8_,'\0');
    pfStack_1b60 = (fdb_iterator *)0x114165;
    fVar4 = fdb_snapshot_open(pfStack_1b10,&pfStack_1b18,0xffffffffffffffff);
    pfVar14 = (fdb_kvs_handle *)0x14;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145bd;
    pfVar14 = (fdb_kvs_handle *)&pfStack_1b48;
    pfStack_1b60 = (fdb_iterator *)0x1141b0;
    fdb_doc_create((fdb_doc **)pfVar14,
                   (void *)(*(size_t **)
                             (auStack_1b08 + (((long)pfStack_1b20 << 0x20) + 0x100000000 >> 0x1d)))
                           [4],
                   **(size_t **)
                     (auStack_1b08 + (((long)pfStack_1b20 << 0x20) + 0x100000000 >> 0x1d)),
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_1b60 = (fdb_iterator *)0x1141bd;
    fVar4 = fdb_get_metaonly(pfStack_1b28,(fdb_doc *)pfStack_1b48);
    if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001145c2;
    pfStack_1b60 = (fdb_iterator *)0x1141d3;
    fdb_doc_free((fdb_doc *)pfStack_1b48);
    pfStack_1b60 = (fdb_iterator *)0x1141f7;
    fdb_doc_create((fdb_doc **)&pfStack_1b48,*(kvs_ops_stat **)(auStack_1b08._40_8_ + 0x20),
                   *(size_t *)(fdb_kvs_config *)auStack_1b08._40_8_,(void *)0x0,0,(void *)0x0,0);
    pfStack_1b60 = (fdb_iterator *)0x114204;
    fVar4 = fdb_get_metaonly(pfStack_1b28,(fdb_doc *)pfStack_1b48);
    unaff_R12 = (char *)auStack_1b08._40_8_;
    doc_01 = pfStack_1b48;
    pfVar14 = (fdb_kvs_handle *)&pfStack_1b48;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145c7;
    pfVar7 = (fdb_kvs_handle *)pfStack_1b48->op_stats;
    config = *(fdb_iterator **)(auStack_1b08._40_8_ + 0x20);
    pfStack_1b60 = (fdb_iterator *)0x11422e;
    iVar5 = bcmp(pfVar7,config,*(size_t *)(fdb_kvs_config *)auStack_1b08._40_8_);
    if (iVar5 != 0) goto LAB_001145cc;
    pfVar7 = (fdb_kvs_handle *)doc_01->staletree;
    config = *(fdb_iterator **)((long)unaff_R12 + 0x38);
    pfStack_1b60 = (fdb_iterator *)0x11424f;
    iVar5 = bcmp(pfVar7,config,(size_t)((fdb_kvs_config *)unaff_R12)->custom_cmp);
    if (iVar5 != 0) goto LAB_001145d7;
    pfStack_1b60 = (fdb_iterator *)0x11425f;
    fdb_doc_free((fdb_doc *)doc_01);
    pfStack_1b60 = (fdb_iterator *)0x114280;
    fdb_doc_create((fdb_doc **)&pfStack_1b48,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    pfStack_1b48->fhandle = (fdb_file_handle *)0x6;
    pfStack_1b60 = (fdb_iterator *)0x114295;
    fVar4 = fdb_get_byseq(pfStack_1b28,(fdb_doc *)pfStack_1b48);
    pfVar14 = pfStack_1b48;
    doc_01 = (fdb_kvs_handle *)&pfStack_1b48;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145e2;
    pfVar7 = (fdb_kvs_handle *)pfStack_1b48->op_stats;
    config = *(fdb_iterator **)(auStack_1b08._40_8_ + 0x20);
    pfStack_1b60 = (fdb_iterator *)0x1142be;
    iVar5 = bcmp(pfVar7,config,*(size_t *)&pfStack_1b48->kvs_config);
    unaff_R12 = (char *)auStack_1b08._40_8_;
    if (iVar5 != 0) goto LAB_001145e7;
    pfVar7 = (fdb_kvs_handle *)(pfVar14->field_6).seqtree;
    config = (fdb_iterator *)
             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_1b08._40_8_ + 0x40))->
             seqtree;
    pfStack_1b60 = (fdb_iterator *)0x1142de;
    iVar5 = bcmp(pfVar7,config,(size_t)(pfVar14->kvs_config).custom_cmp_param);
    if (iVar5 != 0) goto LAB_001145f2;
    pfStack_1b60 = (fdb_iterator *)0x1142ee;
    fdb_doc_free((fdb_doc *)pfVar14);
    pfVar14 = (fdb_kvs_handle *)&pfStack_1b48;
    pfStack_1b48 = (fdb_kvs_handle *)0x0;
    pfVar12 = (fdb_kvs_handle *)0x0;
    pfStack_1b60 = (fdb_iterator *)0x11431d;
    fdb_iterator_init(pfStack_1b28,(fdb_iterator **)auStack_1b40,(void *)0x0,0,(void *)0x0,0,0);
    pfVar13 = pfVar7;
    do {
      pfStack_1b60 = (fdb_iterator *)0x11432a;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1b40._0_8_,(fdb_doc **)pfVar14);
      pfVar7 = pfStack_1b48;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0011454f:
        pfStack_1b60 = (fdb_iterator *)0x114554;
        snapshot_clone_test();
        pfVar7 = pfVar13;
LAB_00114554:
        pfStack_1b60 = (fdb_iterator *)0x11455f;
        snapshot_clone_test();
LAB_0011455f:
        pfStack_1b60 = (fdb_iterator *)0x11456a;
        snapshot_clone_test();
        goto LAB_0011456a;
      }
      config = (fdb_iterator *)pfStack_1b48->op_stats;
      doc_00 = *(fdb_iterator **)(auStack_1b08 + (long)pfVar12 * 8);
      unaff_R12 = (char *)doc_00->_seqnum;
      pfStack_1b60 = (fdb_iterator *)0x114352;
      iVar5 = bcmp(config,unaff_R12,*(size_t *)&pfStack_1b48->kvs_config);
      pfVar13 = pfVar7;
      if (iVar5 != 0) {
        pfStack_1b60 = (fdb_iterator *)0x11454f;
        snapshot_clone_test();
        goto LAB_0011454f;
      }
      config = (fdb_iterator *)pfVar7->staletree;
      unaff_R12 = (char *)doc_00->tree_cursor_start;
      pfStack_1b60 = (fdb_iterator *)0x114371;
      iVar5 = bcmp(config,unaff_R12,(size_t)(pfVar7->kvs_config).custom_cmp);
      if (iVar5 != 0) goto LAB_0011455f;
      config = (fdb_iterator *)(pfVar7->field_6).seqtree;
      unaff_R12 = (char *)doc_00->tree_cursor_prev;
      pfStack_1b60 = (fdb_iterator *)0x114390;
      iVar5 = bcmp(config,unaff_R12,(size_t)(pfVar7->kvs_config).custom_cmp_param);
      if (iVar5 != 0) goto LAB_00114554;
      pfStack_1b60 = (fdb_iterator *)0x1143a0;
      fdb_doc_free((fdb_doc *)pfVar7);
      pfStack_1b48 = (fdb_kvs_handle *)0x0;
      pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).field_0x1;
      pfStack_1b60 = (fdb_iterator *)0x1143b6;
      pfVar18 = (fdb_iterator *)auStack_1b40._0_8_;
      fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1b40._0_8_);
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)pfVar12 == 10) {
      pfStack_1b60 = (fdb_iterator *)0x1143d5;
      fdb_iterator_close((fdb_iterator *)auStack_1b40._0_8_);
      pfVar12 = (fdb_kvs_handle *)0x0;
      pfStack_1b60 = (fdb_iterator *)0x1143f6;
      fdb_iterator_init(pfStack_1b18,(fdb_iterator **)auStack_1b40,(void *)0x0,0,(void *)0x0,0,0);
      pfVar14 = (fdb_kvs_handle *)&pfStack_1b48;
      do {
        pfStack_1b60 = (fdb_iterator *)0x114408;
        fVar4 = fdb_iterator_get((fdb_iterator *)auStack_1b40._0_8_,(fdb_doc **)pfVar14);
        pfVar7 = pfStack_1b48;
        if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114575;
        config = (fdb_iterator *)pfStack_1b48->op_stats;
        doc_00 = *(fdb_iterator **)(auStack_1b08 + (long)pfVar12 * 8);
        unaff_R12 = (char *)doc_00->_seqnum;
        pfStack_1b60 = (fdb_iterator *)0x114430;
        iVar5 = bcmp(config,unaff_R12,*(size_t *)&pfStack_1b48->kvs_config);
        if (iVar5 != 0) goto LAB_0011456a;
        config = (fdb_iterator *)pfVar7->staletree;
        unaff_R12 = (char *)doc_00->tree_cursor_start;
        pfStack_1b60 = (fdb_iterator *)0x11444f;
        iVar5 = bcmp(config,unaff_R12,(size_t)(pfVar7->kvs_config).custom_cmp);
        if (iVar5 != 0) goto LAB_00114585;
        config = (fdb_iterator *)(pfVar7->field_6).seqtree;
        unaff_R12 = (char *)doc_00->tree_cursor_prev;
        pfStack_1b60 = (fdb_iterator *)0x11446e;
        iVar5 = bcmp(config,unaff_R12,(size_t)(pfVar7->kvs_config).custom_cmp_param);
        if (iVar5 != 0) goto LAB_0011457a;
        pfStack_1b60 = (fdb_iterator *)0x11447e;
        fdb_doc_free((fdb_doc *)pfVar7);
        pfStack_1b48 = (fdb_kvs_handle *)0x0;
        pfVar12 = (fdb_kvs_handle *)&(pfVar12->kvs_config).field_0x1;
        pfStack_1b60 = (fdb_iterator *)0x114494;
        pfVar18 = (fdb_iterator *)auStack_1b40._0_8_;
        fVar4 = fdb_iterator_next((fdb_iterator *)auStack_1b40._0_8_);
        pfVar13 = pfVar7;
      } while (fVar4 == FDB_RESULT_SUCCESS);
      if ((int)pfVar12 == 10) {
        pfStack_1b60 = (fdb_iterator *)0x1144b0;
        fdb_iterator_close((fdb_iterator *)auStack_1b40._0_8_);
        pfStack_1b60 = (fdb_iterator *)0x1144ba;
        fdb_kvs_close(pfStack_1b50);
        pfStack_1b60 = (fdb_iterator *)0x1144c4;
        fdb_kvs_close(pfStack_1b10);
        pfStack_1b60 = (fdb_iterator *)0x1144ce;
        fdb_kvs_close(pfStack_1b18);
        pfStack_1b60 = (fdb_iterator *)0x1144d8;
        fdb_kvs_close(pfStack_1b28);
        pfStack_1b60 = (fdb_iterator *)0x1144e2;
        fdb_close((fdb_file_handle *)auStack_1b40._16_8_);
        lVar19 = 0;
        do {
          pfStack_1b60 = (fdb_iterator *)0x1144ee;
          fdb_doc_free(*(fdb_doc **)(auStack_1b08 + lVar19 * 8));
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0x14);
        pfStack_1b60 = (fdb_iterator *)0x1144fc;
        fdb_shutdown();
        pfStack_1b60 = (fdb_iterator *)0x114501;
        memleak_end();
        pcVar20 = "%s PASSED\n";
        if (snapshot_clone_test()::__test_pass != '\0') {
          pcVar20 = "%s FAILED\n";
        }
        pfStack_1b60 = (fdb_iterator *)0x114532;
        fprintf(_stderr,pcVar20,"snapshot clone test");
        return;
      }
      goto LAB_00114602;
    }
  }
  else {
LAB_00114590:
    pfStack_1b60 = (fdb_iterator *)0x114595;
    snapshot_clone_test();
LAB_00114595:
    pfStack_1b60 = (fdb_iterator *)0x11459a;
    snapshot_clone_test();
    pfVar13 = (fdb_kvs_handle *)unaff_R12;
LAB_0011459a:
    pfStack_1b60 = (fdb_iterator *)0x11459f;
    snapshot_clone_test();
LAB_0011459f:
    pfStack_1b60 = (fdb_iterator *)0x1145a4;
    snapshot_clone_test();
LAB_001145a4:
    pfStack_1b60 = (fdb_iterator *)0x1145a9;
    snapshot_clone_test();
LAB_001145a9:
    pfStack_1b60 = (fdb_iterator *)0x1145ae;
    snapshot_clone_test();
LAB_001145ae:
    pfStack_1b60 = (fdb_iterator *)0x1145b3;
    snapshot_clone_test();
LAB_001145b3:
    pfStack_1b60 = (fdb_iterator *)0x1145b8;
    snapshot_clone_test();
LAB_001145b8:
    pfStack_1b60 = (fdb_iterator *)0x1145bd;
    snapshot_clone_test();
LAB_001145bd:
    pfStack_1b60 = (fdb_iterator *)0x1145c2;
    snapshot_clone_test();
LAB_001145c2:
    pfStack_1b60 = (fdb_iterator *)0x1145c7;
    snapshot_clone_test();
LAB_001145c7:
    unaff_R12 = (char *)pfVar13;
    doc_01 = pfVar14;
    pfStack_1b60 = (fdb_iterator *)0x1145cc;
    snapshot_clone_test();
LAB_001145cc:
    pfStack_1b60 = (fdb_iterator *)0x1145d7;
    snapshot_clone_test();
LAB_001145d7:
    pfStack_1b60 = (fdb_iterator *)0x1145e2;
    snapshot_clone_test();
LAB_001145e2:
    pfVar14 = doc_01;
    pfStack_1b60 = (fdb_iterator *)0x1145e7;
    snapshot_clone_test();
LAB_001145e7:
    pfStack_1b60 = (fdb_iterator *)0x1145f2;
    snapshot_clone_test();
LAB_001145f2:
    pfStack_1b60 = (fdb_iterator *)0x1145fd;
    pfVar18 = config;
    snapshot_clone_test();
  }
  pfStack_1b60 = (fdb_iterator *)0x114602;
  snapshot_clone_test();
LAB_00114602:
  pfStack_1b60 = (fdb_iterator *)snap_clone_thread;
  snapshot_clone_test();
  pfStack_1bb8 = (fdb_doc *)0x0;
  lVar19 = (((atomic<unsigned_long> *)&pfVar18->handle)->super___atomic_base<unsigned_long>)._M_i;
  iVar5 = *(int *)&(((atomic<unsigned_long> *)&pfVar18->seqtree_iterator)->
                   super___atomic_base<unsigned_long>)._M_i;
  pfStack_1b88 = pfVar14;
  pfStack_1b80 = (fdb_kvs_handle *)unaff_R12;
  pfStack_1b78 = pfVar12;
  pfStack_1b70 = pfVar7;
  pfStack_1b68 = config;
  pfStack_1b60 = doc_00;
  gettimeofday(&tStack_1b98,(__timezone_ptr_t)0x0);
  fVar4 = fdb_snapshot_open((fdb_kvs_handle *)
                            (((atomic<unsigned_long> *)&pfVar18->hbtrie_iterator)->
                            super___atomic_base<unsigned_long>)._M_i,&pfStack_1ba0,
                            0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x7d5);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x7d5,"void *snap_clone_thread(void *)");
  }
  lVar16 = 0;
  iStack_1ba4 = iVar5;
  fdb_iterator_init(pfStack_1ba0,&pfStack_1bb0,(void *)0x0,0,(void *)0x0,0,0);
  do {
    fVar4 = fdb_iterator_get(pfStack_1bb0,&pfStack_1bb8);
    doc = pfStack_1bb8;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7df);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7df,"void *snap_clone_thread(void *)");
    }
    pvVar1 = pfStack_1bb8->key;
    lVar2 = *(long *)(lVar19 + lVar16 * 8);
    pvVar3 = *(void **)(lVar2 + 0x20);
    iVar5 = bcmp(pvVar1,pvVar3,pfStack_1bb8->keylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e0);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e0,"void *snap_clone_thread(void *)");
    }
    pvVar1 = doc->body;
    pvVar3 = *(void **)(lVar2 + 0x40);
    iVar5 = bcmp(pvVar1,pvVar3,doc->bodylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e1);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e1,"void *snap_clone_thread(void *)");
    }
    fdb_doc_free(doc);
    pfStack_1bb8 = (fdb_doc *)0x0;
    lVar16 = lVar16 + 1;
    fVar4 = fdb_iterator_next(pfStack_1bb0);
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if (iStack_1ba4 / 2 == (int)lVar16) {
    fdb_iterator_close(pfStack_1bb0);
    fdb_kvs_close(pfStack_1ba0);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x7e9);
  __assert_fail("count==n/2",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x7e9,"void *snap_clone_thread(void *)");
}

Assistant:

void snapshot_with_uncomitted_data_test()
{
    TEST_INIT();

    int n = 10, value_len=32;
    int i, r, idx;
    char cmd[256];
    char key[256], *value;
    char keystr[] = "key%06d";
    char valuestr[] = "value%d";
    fdb_file_handle *db_file;
    fdb_kvs_handle *db0, *db1, *db2, *snap;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_kvs_info info;
    fdb_seqnum_t seqnum;
    fdb_status s; (void)s;

    sprintf(cmd, SHELL_DEL " mvcc_test* > errorlog.txt");
    r = system(cmd);
    (void)r;

    memleak_start();

    value = (char*)malloc(value_len);

    srand(1234);
    config = fdb_get_default_config();
    config.seqtree_opt = FDB_SEQTREE_USE;
    config.wal_flush_before_commit = true;
    config.multi_kv_instances = true;
    config.buffercache_size = 0*1024*1024;

    kvs_config = fdb_get_default_kvs_config();

    s = fdb_open(&db_file, "./mvcc_test9", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db0, NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db1, "db1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_open(db_file, &db2, "db2", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // insert docs in all KV stores
    for (i=0;i<n;++i){
        idx = i;
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        sprintf(value, valuestr, idx);
        s = fdb_set_kv(db0, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_set_kv(db1, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_set_kv(db2, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    // try to open snapshot before commit
    s = fdb_get_kvs_info(db0, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_snapshot_open(db0, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);

    s = fdb_get_kvs_info(db1, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_snapshot_open(db1, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);

    s = fdb_get_kvs_info(db2, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_snapshot_open(db2, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);

    s = fdb_commit(db_file, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_get_kvs_info(db1, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    seqnum = info.last_seqnum;

    s = fdb_get_kvs_info(db2, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(seqnum == info.last_seqnum);

    s = fdb_get_kvs_info(db0, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(seqnum == info.last_seqnum);

    // now insert docs into default and db2 only, without commit
    for (i=0;i<n;++i){
        idx = i;
        sprintf(key, keystr, idx);
        memset(value, 'x', value_len);
        memcpy(value + value_len - 6, "<end>", 6);
        sprintf(value, valuestr, idx);
        s = fdb_set_kv(db0, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        s = fdb_set_kv(db2, key, strlen(key)+1, value, value_len);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    // open snapshot on db1
    s = fdb_get_kvs_info(db1, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    // latest (comitted) seqnum
    s = fdb_snapshot_open(db1, &snap, info.last_seqnum);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_close(snap);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // open snapshot on db2
    s = fdb_get_kvs_info(db2, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // latest (uncomitted) seqnum
    s = fdb_snapshot_open(db2, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);
    // committed seqnum
    s = fdb_snapshot_open(db2, &snap, seqnum);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_close(snap);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // open snapshot on default KVS
    s = fdb_get_kvs_info(db0, &info);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // latest (uncomitted) seqnum
    s = fdb_snapshot_open(db0, &snap, info.last_seqnum);
    TEST_CHK(s != FDB_RESULT_SUCCESS);
    // committed seqnum
    s = fdb_snapshot_open(db0, &snap, seqnum);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_kvs_close(snap);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_close(db_file);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    free(value);
    memleak_end();

    TEST_RESULT("snapshot with uncomitted data in other KVS test");
}